

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PMP_Multilinear_64.h
# Opt level: O2

uint64_t __thiscall
PMP_Multilinear_Hasher_64::_hash_noRecursionNoInline_type2
          (PMP_Multilinear_Hasher_64 *this,uchar *chars,size_t cnt)

{
  random_data_for_PMPML_64 *prVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [32];
  undefined1 auVar495 [32];
  undefined1 auVar496 [32];
  undefined1 auVar497 [32];
  undefined1 auVar498 [16];
  ulong uVar499;
  ulong uVar500;
  ulong uVar501;
  int i_2;
  ulong uVar502;
  ulong uVar503;
  ulong uVar504;
  ulong uVar505;
  ulong uVar506;
  long *plVar507;
  ulong uVar508;
  ulong uVar509;
  uint uVar510;
  ulong uVar511;
  ulong uVar512;
  ulong uVar513;
  ulong uVar514;
  ulong uVar515;
  ulong uVar516;
  ulong uVar517;
  ulong uVar518;
  long lVar519;
  ulong uVar520;
  ulong uVar521;
  ulong uVar522;
  ulong uVar523;
  ulong uVar524;
  ulong uVar525;
  ulong uVar526;
  uint uVar527;
  uchar *puVar528;
  ulong *puVar529;
  int iVar530;
  uint64_t i;
  ulong uVar531;
  long lVar532;
  long lVar533;
  uint uVar534;
  long lVar535;
  ulong uVar536;
  long lVar537;
  long lVar538;
  int i_1;
  uint uVar539;
  int iVar540;
  long lVar541;
  ulong uVar542;
  ulong uVar543;
  ulong uVar544;
  ulong uVar545;
  ulong uVar546;
  ulong uVar547;
  ulong uVar548;
  uint uVar549;
  bool bVar550;
  undefined1 auVar551 [64];
  undefined1 auVar552 [64];
  undefined1 auVar553 [64];
  undefined1 auVar554 [64];
  undefined1 auVar555 [64];
  undefined1 auVar556 [64];
  undefined1 auVar557 [32];
  undefined1 auVar558 [32];
  undefined1 auVar559 [32];
  undefined1 auVar560 [32];
  undefined1 auVar561 [32];
  undefined1 auVar562 [32];
  undefined1 auVar563 [32];
  undefined1 auVar564 [32];
  undefined1 auVar565 [32];
  size_t cnts [8];
  _ULARGELARGE_INTEGER__XX allValues [1024];
  long local_4708;
  ulong local_4700;
  ulong local_46f8;
  ulong local_46f0;
  ulong local_46e0;
  ulong auStack_4078 [8];
  ulong auStack_4038 [63];
  long local_3e40 [1976];
  ULARGE_INTEGER__XX ctr2;
  ULARGE_INTEGER__XX mulHigh;
  ULARGE_INTEGER__XX c_ctr1;
  ULARGE_INTEGER__XX mulHigh_2;
  
  auStack_4078[1] = 0;
  puVar528 = chars + 0x78;
  uVar534 = 0;
  for (uVar501 = 0; uVar501 != cnt >> 10; uVar501 = uVar501 + 1) {
    prVar1 = this->curr_rd;
    auVar551 = ZEXT1664((undefined1  [16])0x0);
    auVar552 = ZEXT1664((undefined1  [16])0x0);
    auVar554 = ZEXT1664((undefined1  [16])0x0);
    auVar556 = ZEXT1664((undefined1  [16])0x0);
    auVar553 = ZEXT1664((undefined1  [16])0x0);
    auVar555 = ZEXT1664((undefined1  [16])0x0);
    lVar541 = 0;
    uVar531 = 0;
    lVar535 = 0;
    uVar503 = 0;
    uVar500 = prVar1->const_term;
    while (uVar531 < 0x80) {
      auVar557 = *(undefined1 (*) [32])((long)prVar1->random_coeff + lVar541);
      auVar558 = *(undefined1 (*) [32])(puVar528 + lVar541 + -0x78);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *(ulong *)(puVar528 + lVar541 + -0x58);
      auVar251._8_8_ = 0;
      auVar251._0_8_ = *(ulong *)((long)prVar1->random_coeff + lVar541 + 0x20);
      uVar511 = SUB168(auVar2 * auVar251,8);
      uVar499 = SUB168(auVar2 * auVar251,0);
      uVar502 = uVar500 + uVar499;
      uVar499 = (ulong)CARRY8(uVar500,uVar499);
      bVar550 = CARRY8(uVar503,uVar511);
      uVar511 = uVar503 + uVar511;
      uVar542 = uVar511 + uVar499;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = *(ulong *)(puVar528 + lVar541 + -0x50);
      auVar252._8_8_ = 0;
      auVar252._0_8_ = *(ulong *)((long)prVar1->random_coeff + lVar541 + 0x28);
      uVar512 = SUB168(auVar3 * auVar252,8);
      uVar500 = SUB168(auVar3 * auVar252,0);
      uVar503 = uVar502 + uVar500;
      uVar502 = (ulong)CARRY8(uVar502,uVar500);
      uVar523 = uVar542 + uVar512;
      uVar543 = uVar523 + uVar502;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = *(ulong *)(puVar528 + lVar541 + -0x48);
      auVar253._8_8_ = 0;
      auVar253._0_8_ = *(ulong *)((long)prVar1->random_coeff + lVar541 + 0x30);
      uVar513 = SUB168(auVar4 * auVar253,8);
      uVar500 = SUB168(auVar4 * auVar253,0);
      uVar504 = uVar503 + uVar500;
      uVar536 = (ulong)CARRY8(uVar503,uVar500);
      uVar524 = uVar543 + uVar513;
      uVar544 = uVar524 + uVar536;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = *(ulong *)(puVar528 + lVar541 + -0x40);
      auVar254._8_8_ = 0;
      auVar254._0_8_ = *(ulong *)((long)prVar1->random_coeff + lVar541 + 0x38);
      uVar514 = SUB168(auVar5 * auVar254,8);
      uVar500 = SUB168(auVar5 * auVar254,0);
      uVar503 = uVar504 + uVar500;
      uVar504 = (ulong)CARRY8(uVar504,uVar500);
      uVar525 = uVar544 + uVar514;
      uVar545 = uVar525 + uVar504;
      uVar531 = uVar531 + 0x10;
      auVar560 = vpmuludq_avx2(auVar558,auVar557);
      auVar559 = vpaddq_avx2(auVar560,auVar555._0_32_);
      auVar560 = vpsrlq_avx2(auVar560,0x20);
      auVar560 = vpaddq_avx2(auVar560,auVar553._0_32_);
      auVar561 = vpsrlq_avx2(auVar557,0x20);
      auVar495 = vpmuludq_avx2(auVar561,auVar558);
      auVar558 = vpsrlq_avx2(auVar558,0x20);
      auVar496 = vpmuludq_avx2(auVar558,auVar557);
      auVar558 = vpmuludq_avx2(auVar561,auVar558);
      auVar557 = *(undefined1 (*) [32])(puVar528 + lVar541 + -0x38);
      auVar561 = vpaddq_avx2(auVar495,auVar556._0_32_);
      auVar562 = vpsrlq_avx2(auVar495,0x20);
      auVar495 = vpaddq_avx2(auVar558,auVar552._0_32_);
      auVar558 = vpsrlq_avx2(auVar558,0x20);
      auVar562 = vpaddq_avx2(auVar562,auVar554._0_32_);
      auVar563 = vpsrlq_avx2(auVar496,0x20);
      auVar494 = vpaddq_avx2(auVar558,auVar551._0_32_);
      auVar558 = *(undefined1 (*) [32])((long)prVar1->random_coeff + lVar541 + 0x40);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = *(ulong *)(puVar528 + lVar541 + -0x18);
      auVar255._8_8_ = 0;
      auVar255._0_8_ = *(ulong *)((long)prVar1->random_coeff + lVar541 + 0x60);
      uVar515 = SUB168(auVar6 * auVar255,8);
      uVar500 = SUB168(auVar6 * auVar255,0);
      uVar505 = uVar503 + uVar500;
      uVar508 = (ulong)CARRY8(uVar503,uVar500);
      uVar526 = uVar545 + uVar515;
      uVar546 = uVar526 + uVar508;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = *(ulong *)(puVar528 + lVar541 + -0x10);
      auVar256._8_8_ = 0;
      auVar256._0_8_ = *(ulong *)((long)prVar1->random_coeff + lVar541 + 0x68);
      uVar516 = SUB168(auVar7 * auVar256,8);
      uVar500 = SUB168(auVar7 * auVar256,0);
      uVar503 = uVar505 + uVar500;
      uVar505 = (ulong)CARRY8(uVar505,uVar500);
      uVar521 = uVar546 + uVar516;
      uVar547 = uVar521 + uVar505;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = *(ulong *)(puVar528 + lVar541 + -8);
      auVar257._8_8_ = 0;
      auVar257._0_8_ = *(ulong *)((long)prVar1->random_coeff + lVar541 + 0x70);
      uVar517 = SUB168(auVar8 * auVar257,8);
      uVar500 = SUB168(auVar8 * auVar257,0);
      uVar506 = uVar503 + uVar500;
      uVar509 = (ulong)CARRY8(uVar503,uVar500);
      uVar522 = uVar547 + uVar517;
      uVar548 = uVar522 + uVar509;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = *(ulong *)(puVar528 + lVar541);
      auVar258._8_8_ = 0;
      auVar258._0_8_ = *(ulong *)((long)prVar1->random_coeff + lVar541 + 0x78);
      uVar518 = SUB168(auVar9 * auVar258,8);
      uVar503 = SUB168(auVar9 * auVar258,0);
      uVar500 = uVar506 + uVar503;
      uVar506 = (ulong)CARRY8(uVar506,uVar503);
      uVar520 = uVar548 + uVar518;
      uVar503 = uVar520 + uVar506;
      lVar535 = lVar535 + (ulong)(bVar550 || CARRY8(uVar511,uVar499)) +
                (ulong)(CARRY8(uVar542,uVar512) || CARRY8(uVar523,uVar502)) +
                (ulong)(CARRY8(uVar543,uVar513) || CARRY8(uVar524,uVar536)) +
                (ulong)(CARRY8(uVar544,uVar514) || CARRY8(uVar525,uVar504)) +
                (ulong)(CARRY8(uVar545,uVar515) || CARRY8(uVar526,uVar508)) +
                (ulong)(CARRY8(uVar546,uVar516) || CARRY8(uVar521,uVar505)) +
                (ulong)(CARRY8(uVar547,uVar517) || CARRY8(uVar522,uVar509)) +
                (ulong)(CARRY8(uVar548,uVar518) || CARRY8(uVar520,uVar506));
      lVar541 = lVar541 + 0x80;
      auVar565 = vpsrlq_avx2(auVar558,0x20);
      auVar564 = vpmuludq_avx2(auVar557,auVar558);
      auVar497 = vpmuludq_avx2(auVar557,auVar565);
      auVar559 = vpaddq_avx2(auVar564,auVar559);
      auVar555 = ZEXT3264(auVar559);
      auVar564 = vpsrlq_avx2(auVar564,0x20);
      auVar559 = vpaddq_avx2(auVar497,auVar496);
      auVar560 = vpaddq_avx2(auVar564,auVar560);
      auVar553 = ZEXT3264(auVar560);
      auVar559 = vpaddq_avx2(auVar561,auVar559);
      auVar560 = vpsrlq_avx2(auVar497,0x20);
      auVar560 = vpaddq_avx2(auVar563,auVar560);
      auVar560 = vpaddq_avx2(auVar562,auVar560);
      auVar557 = vpsrlq_avx2(auVar557,0x20);
      auVar558 = vpmuludq_avx2(auVar557,auVar558);
      auVar561 = vpmuludq_avx2(auVar565,auVar557);
      auVar557 = vpaddq_avx2(auVar559,auVar558);
      auVar556 = ZEXT3264(auVar557);
      auVar559 = vpsrlq_avx2(auVar558,0x20);
      auVar557 = vpaddq_avx2(auVar495,auVar561);
      auVar552 = ZEXT3264(auVar557);
      auVar558 = vpsrlq_avx2(auVar561,0x20);
      auVar557 = vpaddq_avx2(auVar560,auVar559);
      auVar554 = ZEXT3264(auVar557);
      auVar557 = vpaddq_avx2(auVar494,auVar558);
      auVar551 = ZEXT3264(auVar557);
    }
    auVar2 = vpaddq_avx(auVar555._0_16_,auVar555._16_16_);
    auVar3 = vpshufd_avx(auVar2,0xee);
    auVar2 = vpaddq_avx(auVar2,auVar3);
    auVar3 = vpaddq_avx(auVar553._0_16_,auVar553._16_16_);
    auVar4 = vpshufd_avx(auVar3,0xee);
    auVar3 = vpaddq_avx(auVar3,auVar4);
    auVar4 = vpaddq_avx(auVar556._0_16_,auVar556._16_16_);
    auVar5 = vpshufd_avx(auVar4,0xee);
    auVar4 = vpaddq_avx(auVar4,auVar5);
    auVar5 = vpaddq_avx(auVar554._0_16_,auVar554._16_16_);
    auVar6 = vpshufd_avx(auVar5,0xee);
    uVar531 = (auVar4._0_8_ & 0xffffffff) + auVar3._0_8_ +
              (ulong)(uint)(auVar2._4_4_ - auVar3._0_4_);
    auVar3 = vpaddq_avx(auVar5,auVar6);
    uVar502 = uVar531 << 0x20 | auVar2._0_8_ & 0xffffffff;
    auVar2 = vpaddq_avx(auVar552._0_16_,auVar552._16_16_);
    auVar5 = vpshufd_avx(auVar2,0xee);
    auVar2 = vpaddq_avx(auVar2,auVar5);
    auVar5 = vpaddq_avx(auVar551._0_16_,auVar551._16_16_);
    auVar6 = vpshufd_avx(auVar5,0xee);
    auVar5 = vpaddq_avx(auVar5,auVar6);
    uVar531 = (auVar2._0_8_ & 0xffffffff) + auVar3._0_8_ +
              (ulong)(uint)(auVar4._4_4_ - auVar3._0_4_) + (uVar531 >> 0x20);
    uVar499 = (uVar531 >> 0x20) + (ulong)(uint)(auVar2._4_4_ - auVar5._0_4_) + auVar5._0_8_;
    uVar536 = uVar502 + uVar500;
    uVar500 = (uVar499 << 0x20 | uVar531 & 0xffffffff) + (ulong)CARRY8(uVar502,uVar500);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar500 + uVar503;
    uVar531 = SUB168(auVar10 * ZEXT816(0xd),0);
    uVar500 = ((uVar499 >> 0x20) + lVar535 + (ulong)CARRY8(uVar500,uVar503)) * 0xa9 + 0xd +
              SUB168(auVar10 * ZEXT816(0xd),8) * 0xd;
    uVar503 = uVar500 + uVar536;
    uVar499 = uVar503 - uVar531;
    uVar500 = (((ulong)CARRY8(uVar500,uVar536) + 1) - (ulong)(uVar503 < uVar531)) * -0xd + uVar499;
    if ((uVar499 < 0x1a) && (0x19 < uVar500)) {
      bVar550 = 0xfffffffffffffff2 < uVar500;
      uVar500 = uVar500 + 0xd;
      uVar531 = (ulong)bVar550;
    }
    else {
      uVar531 = 0;
    }
    lVar535 = 0x538;
    iVar530 = 0x80;
    lVar541 = 1;
    while( true ) {
      uVar503 = auStack_4078[lVar541];
      lVar519 = (long)(int)((uint)lVar541 << 7);
      auStack_4078[lVar541] = uVar503 + 1;
      auStack_4038[uVar503 * 2 + lVar519 * 2] = uVar500;
      auStack_4038[uVar503 * 2 + lVar519 * 2 + 1] = uVar531;
      if (uVar503 + 1 != 0x80) break;
      auStack_4078[lVar541] = 0;
      prVar1 = this->curr_rd;
      plVar507 = local_3e40 + (long)iVar530 * 2;
      local_46f8 = prVar1[lVar541].const_term;
      local_4700 = 0;
      local_4708 = 0;
      for (uVar500 = 0; uVar500 < 0x80; uVar500 = uVar500 + 0x20) {
        if (plVar507[-0x3e] == 0) {
          auVar11._8_8_ = 0;
          auVar11._0_8_ = plVar507[-0x3f];
          auVar259._8_8_ = 0;
          auVar259._0_8_ = *(ulong *)((long)prVar1 + uVar500 * 8 + lVar535 + -0xf8);
          uVar499 = SUB168(auVar11 * auVar259,8);
          uVar503 = SUB168(auVar11 * auVar259,0);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        else {
          auVar43._8_8_ = 0;
          auVar43._0_8_ = plVar507[-0x3f];
          auVar291._8_8_ = 0;
          auVar291._0_8_ = *(ulong *)((long)prVar1 + uVar500 * 8 + lVar535 + -0xf8);
          uVar503 = SUB168(auVar43 * auVar291,0);
          uVar499 = plVar507[-0x3e] * *(long *)((long)prVar1 + uVar500 * 8 + lVar535 + -0xf8) +
                    SUB168(auVar43 * auVar291,8);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        local_46f8 = local_46f8 + uVar503;
        local_4708 = local_4708 + (ulong)bVar550;
        if (plVar507[-0x3c] == 0) {
          auVar12._8_8_ = 0;
          auVar12._0_8_ = plVar507[-0x3d];
          auVar260._8_8_ = 0;
          auVar260._0_8_ = *(ulong *)((long)prVar1 + uVar500 * 8 + lVar535 + -0xf0);
          uVar499 = SUB168(auVar12 * auVar260,8);
          uVar503 = SUB168(auVar12 * auVar260,0);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        else {
          auVar44._8_8_ = 0;
          auVar44._0_8_ = plVar507[-0x3d];
          auVar292._8_8_ = 0;
          auVar292._0_8_ = *(ulong *)((long)prVar1 + uVar500 * 8 + lVar535 + -0xf0);
          uVar503 = SUB168(auVar44 * auVar292,0);
          uVar499 = plVar507[-0x3c] * *(long *)((long)prVar1 + uVar500 * 8 + lVar535 + -0xf0) +
                    SUB168(auVar44 * auVar292,8);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        local_46f8 = local_46f8 + uVar503;
        local_4708 = local_4708 + (ulong)bVar550;
        if (plVar507[-0x3a] == 0) {
          auVar13._8_8_ = 0;
          auVar13._0_8_ = plVar507[-0x3b];
          auVar261._8_8_ = 0;
          auVar261._0_8_ = *(ulong *)((long)prVar1 + uVar500 * 8 + lVar535 + -0xe8);
          uVar499 = SUB168(auVar13 * auVar261,8);
          uVar503 = SUB168(auVar13 * auVar261,0);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        else {
          auVar45._8_8_ = 0;
          auVar45._0_8_ = plVar507[-0x3b];
          auVar293._8_8_ = 0;
          auVar293._0_8_ = *(ulong *)((long)prVar1 + uVar500 * 8 + lVar535 + -0xe8);
          uVar503 = SUB168(auVar45 * auVar293,0);
          uVar499 = plVar507[-0x3a] * *(long *)((long)prVar1 + uVar500 * 8 + lVar535 + -0xe8) +
                    SUB168(auVar45 * auVar293,8);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        local_46f8 = local_46f8 + uVar503;
        local_4708 = local_4708 + (ulong)bVar550;
        if (plVar507[-0x38] == 0) {
          auVar14._8_8_ = 0;
          auVar14._0_8_ = plVar507[-0x39];
          auVar262._8_8_ = 0;
          auVar262._0_8_ = *(ulong *)((long)prVar1 + uVar500 * 8 + lVar535 + -0xe0);
          uVar499 = SUB168(auVar14 * auVar262,8);
          uVar503 = SUB168(auVar14 * auVar262,0);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        else {
          auVar46._8_8_ = 0;
          auVar46._0_8_ = plVar507[-0x39];
          auVar294._8_8_ = 0;
          auVar294._0_8_ = *(ulong *)((long)prVar1 + uVar500 * 8 + lVar535 + -0xe0);
          uVar503 = SUB168(auVar46 * auVar294,0);
          uVar499 = plVar507[-0x38] * *(long *)((long)prVar1 + uVar500 * 8 + lVar535 + -0xe0) +
                    SUB168(auVar46 * auVar294,8);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        local_46f8 = local_46f8 + uVar503;
        local_4708 = local_4708 + (ulong)bVar550;
        if (plVar507[-0x36] == 0) {
          auVar15._8_8_ = 0;
          auVar15._0_8_ = plVar507[-0x37];
          auVar263._8_8_ = 0;
          auVar263._0_8_ = *(ulong *)((long)prVar1 + uVar500 * 8 + lVar535 + -0xd8);
          uVar499 = SUB168(auVar15 * auVar263,8);
          uVar503 = SUB168(auVar15 * auVar263,0);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        else {
          auVar47._8_8_ = 0;
          auVar47._0_8_ = plVar507[-0x37];
          auVar295._8_8_ = 0;
          auVar295._0_8_ = *(ulong *)((long)prVar1 + uVar500 * 8 + lVar535 + -0xd8);
          uVar503 = SUB168(auVar47 * auVar295,0);
          uVar499 = plVar507[-0x36] * *(long *)((long)prVar1 + uVar500 * 8 + lVar535 + -0xd8) +
                    SUB168(auVar47 * auVar295,8);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        local_46f8 = local_46f8 + uVar503;
        local_4708 = local_4708 + (ulong)bVar550;
        if (plVar507[-0x34] == 0) {
          auVar16._8_8_ = 0;
          auVar16._0_8_ = plVar507[-0x35];
          auVar264._8_8_ = 0;
          auVar264._0_8_ = *(ulong *)((long)prVar1 + uVar500 * 8 + lVar535 + -0xd0);
          uVar499 = SUB168(auVar16 * auVar264,8);
          uVar503 = SUB168(auVar16 * auVar264,0);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        else {
          auVar48._8_8_ = 0;
          auVar48._0_8_ = plVar507[-0x35];
          auVar296._8_8_ = 0;
          auVar296._0_8_ = *(ulong *)((long)prVar1 + uVar500 * 8 + lVar535 + -0xd0);
          uVar503 = SUB168(auVar48 * auVar296,0);
          uVar499 = plVar507[-0x34] * *(long *)((long)prVar1 + uVar500 * 8 + lVar535 + -0xd0) +
                    SUB168(auVar48 * auVar296,8);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        local_46f8 = local_46f8 + uVar503;
        local_4708 = local_4708 + (ulong)bVar550;
        if (plVar507[-0x32] == 0) {
          auVar17._8_8_ = 0;
          auVar17._0_8_ = plVar507[-0x33];
          auVar265._8_8_ = 0;
          auVar265._0_8_ = *(ulong *)((long)prVar1 + uVar500 * 8 + lVar535 + -200);
          uVar499 = SUB168(auVar17 * auVar265,8);
          uVar503 = SUB168(auVar17 * auVar265,0);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        else {
          auVar49._8_8_ = 0;
          auVar49._0_8_ = plVar507[-0x33];
          auVar297._8_8_ = 0;
          auVar297._0_8_ = *(ulong *)((long)prVar1 + uVar500 * 8 + lVar535 + -200);
          uVar503 = SUB168(auVar49 * auVar297,0);
          uVar499 = plVar507[-0x32] * *(long *)((long)prVar1 + uVar500 * 8 + lVar535 + -200) +
                    SUB168(auVar49 * auVar297,8);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        local_46f8 = local_46f8 + uVar503;
        local_4708 = local_4708 + (ulong)bVar550;
        if (plVar507[-0x30] == 0) {
          auVar18._8_8_ = 0;
          auVar18._0_8_ = plVar507[-0x31];
          auVar266._8_8_ = 0;
          auVar266._0_8_ = *(ulong *)((long)prVar1 + uVar500 * 8 + lVar535 + -0xc0);
          uVar499 = SUB168(auVar18 * auVar266,8);
          uVar503 = SUB168(auVar18 * auVar266,0);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        else {
          auVar50._8_8_ = 0;
          auVar50._0_8_ = plVar507[-0x31];
          auVar298._8_8_ = 0;
          auVar298._0_8_ = *(ulong *)((long)prVar1 + uVar500 * 8 + lVar535 + -0xc0);
          uVar503 = SUB168(auVar50 * auVar298,0);
          uVar499 = plVar507[-0x30] * *(long *)((long)prVar1 + uVar500 * 8 + lVar535 + -0xc0) +
                    SUB168(auVar50 * auVar298,8);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        local_46f8 = local_46f8 + uVar503;
        local_4708 = local_4708 + (ulong)bVar550;
        if (plVar507[-0x2e] == 0) {
          auVar19._8_8_ = 0;
          auVar19._0_8_ = plVar507[-0x2f];
          auVar267._8_8_ = 0;
          auVar267._0_8_ = *(ulong *)((long)prVar1 + uVar500 * 8 + lVar535 + -0xb8);
          uVar499 = SUB168(auVar19 * auVar267,8);
          uVar503 = SUB168(auVar19 * auVar267,0);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        else {
          auVar51._8_8_ = 0;
          auVar51._0_8_ = plVar507[-0x2f];
          auVar299._8_8_ = 0;
          auVar299._0_8_ = *(ulong *)((long)prVar1 + uVar500 * 8 + lVar535 + -0xb8);
          uVar503 = SUB168(auVar51 * auVar299,0);
          uVar499 = plVar507[-0x2e] * *(long *)((long)prVar1 + uVar500 * 8 + lVar535 + -0xb8) +
                    SUB168(auVar51 * auVar299,8);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        local_46f8 = local_46f8 + uVar503;
        local_4708 = local_4708 + (ulong)bVar550;
        if (plVar507[-0x2c] == 0) {
          auVar20._8_8_ = 0;
          auVar20._0_8_ = plVar507[-0x2d];
          auVar268._8_8_ = 0;
          auVar268._0_8_ = *(ulong *)((long)prVar1 + uVar500 * 8 + lVar535 + -0xb0);
          uVar499 = SUB168(auVar20 * auVar268,8);
          uVar503 = SUB168(auVar20 * auVar268,0);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        else {
          auVar52._8_8_ = 0;
          auVar52._0_8_ = plVar507[-0x2d];
          auVar300._8_8_ = 0;
          auVar300._0_8_ = *(ulong *)((long)prVar1 + uVar500 * 8 + lVar535 + -0xb0);
          uVar503 = SUB168(auVar52 * auVar300,0);
          uVar499 = plVar507[-0x2c] * *(long *)((long)prVar1 + uVar500 * 8 + lVar535 + -0xb0) +
                    SUB168(auVar52 * auVar300,8);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        local_46f8 = local_46f8 + uVar503;
        local_4708 = local_4708 + (ulong)bVar550;
        if (plVar507[-0x2a] == 0) {
          auVar21._8_8_ = 0;
          auVar21._0_8_ = plVar507[-0x2b];
          auVar269._8_8_ = 0;
          auVar269._0_8_ = *(ulong *)((long)prVar1 + uVar500 * 8 + lVar535 + -0xa8);
          uVar499 = SUB168(auVar21 * auVar269,8);
          uVar503 = SUB168(auVar21 * auVar269,0);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        else {
          auVar53._8_8_ = 0;
          auVar53._0_8_ = plVar507[-0x2b];
          auVar301._8_8_ = 0;
          auVar301._0_8_ = *(ulong *)((long)prVar1 + uVar500 * 8 + lVar535 + -0xa8);
          uVar503 = SUB168(auVar53 * auVar301,0);
          uVar499 = plVar507[-0x2a] * *(long *)((long)prVar1 + uVar500 * 8 + lVar535 + -0xa8) +
                    SUB168(auVar53 * auVar301,8);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        local_46f8 = local_46f8 + uVar503;
        local_4708 = local_4708 + (ulong)bVar550;
        if (plVar507[-0x28] == 0) {
          auVar22._8_8_ = 0;
          auVar22._0_8_ = plVar507[-0x29];
          auVar270._8_8_ = 0;
          auVar270._0_8_ = *(ulong *)((long)prVar1 + uVar500 * 8 + lVar535 + -0xa0);
          uVar499 = SUB168(auVar22 * auVar270,8);
          uVar503 = SUB168(auVar22 * auVar270,0);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        else {
          auVar54._8_8_ = 0;
          auVar54._0_8_ = plVar507[-0x29];
          auVar302._8_8_ = 0;
          auVar302._0_8_ = *(ulong *)((long)prVar1 + uVar500 * 8 + lVar535 + -0xa0);
          uVar503 = SUB168(auVar54 * auVar302,0);
          uVar499 = plVar507[-0x28] * *(long *)((long)prVar1 + uVar500 * 8 + lVar535 + -0xa0) +
                    SUB168(auVar54 * auVar302,8);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        local_46f8 = local_46f8 + uVar503;
        local_4708 = local_4708 + (ulong)bVar550;
        if (plVar507[-0x26] == 0) {
          auVar23._8_8_ = 0;
          auVar23._0_8_ = plVar507[-0x27];
          auVar271._8_8_ = 0;
          auVar271._0_8_ = *(ulong *)((long)prVar1 + uVar500 * 8 + lVar535 + -0x98);
          uVar499 = SUB168(auVar23 * auVar271,8);
          uVar503 = SUB168(auVar23 * auVar271,0);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        else {
          auVar55._8_8_ = 0;
          auVar55._0_8_ = plVar507[-0x27];
          auVar303._8_8_ = 0;
          auVar303._0_8_ = *(ulong *)((long)prVar1 + uVar500 * 8 + lVar535 + -0x98);
          uVar503 = SUB168(auVar55 * auVar303,0);
          uVar499 = plVar507[-0x26] * *(long *)((long)prVar1 + uVar500 * 8 + lVar535 + -0x98) +
                    SUB168(auVar55 * auVar303,8);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        local_46f8 = local_46f8 + uVar503;
        local_4708 = local_4708 + (ulong)bVar550;
        if (plVar507[-0x24] == 0) {
          auVar24._8_8_ = 0;
          auVar24._0_8_ = plVar507[-0x25];
          auVar272._8_8_ = 0;
          auVar272._0_8_ = *(ulong *)((long)prVar1 + uVar500 * 8 + lVar535 + -0x90);
          uVar499 = SUB168(auVar24 * auVar272,8);
          uVar503 = SUB168(auVar24 * auVar272,0);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        else {
          auVar56._8_8_ = 0;
          auVar56._0_8_ = plVar507[-0x25];
          auVar304._8_8_ = 0;
          auVar304._0_8_ = *(ulong *)((long)prVar1 + uVar500 * 8 + lVar535 + -0x90);
          uVar503 = SUB168(auVar56 * auVar304,0);
          uVar499 = plVar507[-0x24] * *(long *)((long)prVar1 + uVar500 * 8 + lVar535 + -0x90) +
                    SUB168(auVar56 * auVar304,8);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        local_46f8 = local_46f8 + uVar503;
        local_4708 = local_4708 + (ulong)bVar550;
        if (plVar507[-0x22] == 0) {
          auVar25._8_8_ = 0;
          auVar25._0_8_ = plVar507[-0x23];
          auVar273._8_8_ = 0;
          auVar273._0_8_ = *(ulong *)((long)prVar1 + uVar500 * 8 + lVar535 + -0x88);
          uVar499 = SUB168(auVar25 * auVar273,8);
          uVar503 = SUB168(auVar25 * auVar273,0);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        else {
          auVar57._8_8_ = 0;
          auVar57._0_8_ = plVar507[-0x23];
          auVar305._8_8_ = 0;
          auVar305._0_8_ = *(ulong *)((long)prVar1 + uVar500 * 8 + lVar535 + -0x88);
          uVar503 = SUB168(auVar57 * auVar305,0);
          uVar499 = plVar507[-0x22] * *(long *)((long)prVar1 + uVar500 * 8 + lVar535 + -0x88) +
                    SUB168(auVar57 * auVar305,8);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        local_46f8 = local_46f8 + uVar503;
        local_4708 = local_4708 + (ulong)bVar550;
        if (plVar507[-0x20] == 0) {
          auVar26._8_8_ = 0;
          auVar26._0_8_ = plVar507[-0x21];
          auVar274._8_8_ = 0;
          auVar274._0_8_ = *(ulong *)((long)prVar1 + uVar500 * 8 + lVar535 + -0x80);
          uVar499 = SUB168(auVar26 * auVar274,8);
          uVar503 = SUB168(auVar26 * auVar274,0);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        else {
          auVar58._8_8_ = 0;
          auVar58._0_8_ = plVar507[-0x21];
          auVar306._8_8_ = 0;
          auVar306._0_8_ = *(ulong *)((long)prVar1 + uVar500 * 8 + lVar535 + -0x80);
          uVar503 = SUB168(auVar58 * auVar306,0);
          uVar499 = plVar507[-0x20] * *(long *)((long)prVar1 + uVar500 * 8 + lVar535 + -0x80) +
                    SUB168(auVar58 * auVar306,8);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        local_46f8 = local_46f8 + uVar503;
        local_4708 = local_4708 + (ulong)bVar550;
        if (plVar507[-0x1e] == 0) {
          auVar27._8_8_ = 0;
          auVar27._0_8_ = plVar507[-0x1f];
          auVar275._8_8_ = 0;
          auVar275._0_8_ = *(ulong *)((long)prVar1 + uVar500 * 8 + lVar535 + -0x78);
          uVar499 = SUB168(auVar27 * auVar275,8);
          uVar503 = SUB168(auVar27 * auVar275,0);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        else {
          auVar59._8_8_ = 0;
          auVar59._0_8_ = plVar507[-0x1f];
          auVar307._8_8_ = 0;
          auVar307._0_8_ = *(ulong *)((long)prVar1 + uVar500 * 8 + lVar535 + -0x78);
          uVar503 = SUB168(auVar59 * auVar307,0);
          uVar499 = plVar507[-0x1e] * *(long *)((long)prVar1 + uVar500 * 8 + lVar535 + -0x78) +
                    SUB168(auVar59 * auVar307,8);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        local_46f8 = local_46f8 + uVar503;
        local_4708 = local_4708 + (ulong)bVar550;
        if (plVar507[-0x1c] == 0) {
          auVar28._8_8_ = 0;
          auVar28._0_8_ = plVar507[-0x1d];
          auVar276._8_8_ = 0;
          auVar276._0_8_ = *(ulong *)((long)prVar1 + uVar500 * 8 + lVar535 + -0x70);
          uVar499 = SUB168(auVar28 * auVar276,8);
          uVar503 = SUB168(auVar28 * auVar276,0);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        else {
          auVar60._8_8_ = 0;
          auVar60._0_8_ = plVar507[-0x1d];
          auVar308._8_8_ = 0;
          auVar308._0_8_ = *(ulong *)((long)prVar1 + uVar500 * 8 + lVar535 + -0x70);
          uVar503 = SUB168(auVar60 * auVar308,0);
          uVar499 = plVar507[-0x1c] * *(long *)((long)prVar1 + uVar500 * 8 + lVar535 + -0x70) +
                    SUB168(auVar60 * auVar308,8);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        local_46f8 = local_46f8 + uVar503;
        local_4708 = local_4708 + (ulong)bVar550;
        if (plVar507[-0x1a] == 0) {
          auVar29._8_8_ = 0;
          auVar29._0_8_ = plVar507[-0x1b];
          auVar277._8_8_ = 0;
          auVar277._0_8_ = *(ulong *)((long)prVar1 + uVar500 * 8 + lVar535 + -0x68);
          uVar499 = SUB168(auVar29 * auVar277,8);
          uVar503 = SUB168(auVar29 * auVar277,0);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        else {
          auVar61._8_8_ = 0;
          auVar61._0_8_ = plVar507[-0x1b];
          auVar309._8_8_ = 0;
          auVar309._0_8_ = *(ulong *)((long)prVar1 + uVar500 * 8 + lVar535 + -0x68);
          uVar503 = SUB168(auVar61 * auVar309,0);
          uVar499 = plVar507[-0x1a] * *(long *)((long)prVar1 + uVar500 * 8 + lVar535 + -0x68) +
                    SUB168(auVar61 * auVar309,8);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        local_46f8 = local_46f8 + uVar503;
        local_4708 = local_4708 + (ulong)bVar550;
        if (plVar507[-0x18] == 0) {
          auVar30._8_8_ = 0;
          auVar30._0_8_ = plVar507[-0x19];
          auVar278._8_8_ = 0;
          auVar278._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar500 * 8 + lVar535 + -0x80);
          uVar499 = SUB168(auVar30 * auVar278,8);
          uVar503 = SUB168(auVar30 * auVar278,0);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        else {
          auVar62._8_8_ = 0;
          auVar62._0_8_ = plVar507[-0x19];
          auVar310._8_8_ = 0;
          auVar310._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar500 * 8 + lVar535 + -0x80);
          uVar503 = SUB168(auVar62 * auVar310,0);
          uVar499 = plVar507[-0x18] *
                    *(long *)((long)prVar1->random_coeff + uVar500 * 8 + lVar535 + -0x80) +
                    SUB168(auVar62 * auVar310,8);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        local_46f8 = local_46f8 + uVar503;
        local_4708 = local_4708 + (ulong)bVar550;
        if (plVar507[-0x16] == 0) {
          auVar31._8_8_ = 0;
          auVar31._0_8_ = plVar507[-0x17];
          auVar279._8_8_ = 0;
          auVar279._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar500 * 8 + lVar535 + -0x78);
          uVar499 = SUB168(auVar31 * auVar279,8);
          uVar503 = SUB168(auVar31 * auVar279,0);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        else {
          auVar63._8_8_ = 0;
          auVar63._0_8_ = plVar507[-0x17];
          auVar311._8_8_ = 0;
          auVar311._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar500 * 8 + lVar535 + -0x78);
          uVar503 = SUB168(auVar63 * auVar311,0);
          uVar499 = plVar507[-0x16] *
                    *(long *)((long)prVar1->random_coeff + uVar500 * 8 + lVar535 + -0x78) +
                    SUB168(auVar63 * auVar311,8);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        local_46f8 = local_46f8 + uVar503;
        local_4708 = local_4708 + (ulong)bVar550;
        if (plVar507[-0x14] == 0) {
          auVar32._8_8_ = 0;
          auVar32._0_8_ = plVar507[-0x15];
          auVar280._8_8_ = 0;
          auVar280._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar500 * 8 + lVar535 + -0x70);
          uVar499 = SUB168(auVar32 * auVar280,8);
          uVar503 = SUB168(auVar32 * auVar280,0);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        else {
          auVar64._8_8_ = 0;
          auVar64._0_8_ = plVar507[-0x15];
          auVar312._8_8_ = 0;
          auVar312._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar500 * 8 + lVar535 + -0x70);
          uVar503 = SUB168(auVar64 * auVar312,0);
          uVar499 = plVar507[-0x14] *
                    *(long *)((long)prVar1->random_coeff + uVar500 * 8 + lVar535 + -0x70) +
                    SUB168(auVar64 * auVar312,8);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        local_46f8 = local_46f8 + uVar503;
        local_4708 = local_4708 + (ulong)bVar550;
        if (plVar507[-0x12] == 0) {
          auVar33._8_8_ = 0;
          auVar33._0_8_ = plVar507[-0x13];
          auVar281._8_8_ = 0;
          auVar281._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar500 * 8 + lVar535 + -0x68);
          uVar499 = SUB168(auVar33 * auVar281,8);
          uVar503 = SUB168(auVar33 * auVar281,0);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        else {
          auVar65._8_8_ = 0;
          auVar65._0_8_ = plVar507[-0x13];
          auVar313._8_8_ = 0;
          auVar313._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar500 * 8 + lVar535 + -0x68);
          uVar503 = SUB168(auVar65 * auVar313,0);
          uVar499 = plVar507[-0x12] *
                    *(long *)((long)prVar1->random_coeff + uVar500 * 8 + lVar535 + -0x68) +
                    SUB168(auVar65 * auVar313,8);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        local_46f8 = local_46f8 + uVar503;
        local_4708 = local_4708 + (ulong)bVar550;
        if (plVar507[-0x10] == 0) {
          auVar34._8_8_ = 0;
          auVar34._0_8_ = plVar507[-0x11];
          auVar282._8_8_ = 0;
          auVar282._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar500 * 8 + lVar535 + -0x60);
          uVar499 = SUB168(auVar34 * auVar282,8);
          uVar503 = SUB168(auVar34 * auVar282,0);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        else {
          auVar66._8_8_ = 0;
          auVar66._0_8_ = plVar507[-0x11];
          auVar314._8_8_ = 0;
          auVar314._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar500 * 8 + lVar535 + -0x60);
          uVar503 = SUB168(auVar66 * auVar314,0);
          uVar499 = plVar507[-0x10] *
                    *(long *)((long)prVar1->random_coeff + uVar500 * 8 + lVar535 + -0x60) +
                    SUB168(auVar66 * auVar314,8);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        local_46f8 = local_46f8 + uVar503;
        local_4708 = local_4708 + (ulong)bVar550;
        if (plVar507[-0xe] == 0) {
          auVar35._8_8_ = 0;
          auVar35._0_8_ = plVar507[-0xf];
          auVar283._8_8_ = 0;
          auVar283._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar500 * 8 + lVar535 + -0x58);
          uVar499 = SUB168(auVar35 * auVar283,8);
          uVar503 = SUB168(auVar35 * auVar283,0);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        else {
          auVar67._8_8_ = 0;
          auVar67._0_8_ = plVar507[-0xf];
          auVar315._8_8_ = 0;
          auVar315._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar500 * 8 + lVar535 + -0x58);
          uVar503 = SUB168(auVar67 * auVar315,0);
          uVar499 = plVar507[-0xe] *
                    *(long *)((long)prVar1->random_coeff + uVar500 * 8 + lVar535 + -0x58) +
                    SUB168(auVar67 * auVar315,8);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        local_46f8 = local_46f8 + uVar503;
        local_4708 = local_4708 + (ulong)bVar550;
        if (plVar507[-0xc] == 0) {
          auVar36._8_8_ = 0;
          auVar36._0_8_ = plVar507[-0xd];
          auVar284._8_8_ = 0;
          auVar284._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar500 * 8 + lVar535 + -0x50);
          uVar499 = SUB168(auVar36 * auVar284,8);
          uVar503 = SUB168(auVar36 * auVar284,0);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        else {
          auVar68._8_8_ = 0;
          auVar68._0_8_ = plVar507[-0xd];
          auVar316._8_8_ = 0;
          auVar316._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar500 * 8 + lVar535 + -0x50);
          uVar503 = SUB168(auVar68 * auVar316,0);
          uVar499 = plVar507[-0xc] *
                    *(long *)((long)prVar1->random_coeff + uVar500 * 8 + lVar535 + -0x50) +
                    SUB168(auVar68 * auVar316,8);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        local_46f8 = local_46f8 + uVar503;
        local_4708 = local_4708 + (ulong)bVar550;
        if (plVar507[-10] == 0) {
          auVar37._8_8_ = 0;
          auVar37._0_8_ = plVar507[-0xb];
          auVar285._8_8_ = 0;
          auVar285._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar500 * 8 + lVar535 + -0x48);
          uVar499 = SUB168(auVar37 * auVar285,8);
          uVar503 = SUB168(auVar37 * auVar285,0);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        else {
          auVar69._8_8_ = 0;
          auVar69._0_8_ = plVar507[-0xb];
          auVar317._8_8_ = 0;
          auVar317._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar500 * 8 + lVar535 + -0x48);
          uVar503 = SUB168(auVar69 * auVar317,0);
          uVar499 = plVar507[-10] *
                    *(long *)((long)prVar1->random_coeff + uVar500 * 8 + lVar535 + -0x48) +
                    SUB168(auVar69 * auVar317,8);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        local_46f8 = local_46f8 + uVar503;
        local_4708 = local_4708 + (ulong)bVar550;
        if (plVar507[-8] == 0) {
          auVar38._8_8_ = 0;
          auVar38._0_8_ = plVar507[-9];
          auVar286._8_8_ = 0;
          auVar286._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar500 * 8 + lVar535 + -0x40);
          uVar499 = SUB168(auVar38 * auVar286,8);
          uVar503 = SUB168(auVar38 * auVar286,0);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        else {
          auVar70._8_8_ = 0;
          auVar70._0_8_ = plVar507[-9];
          auVar318._8_8_ = 0;
          auVar318._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar500 * 8 + lVar535 + -0x40);
          uVar503 = SUB168(auVar70 * auVar318,0);
          uVar499 = plVar507[-8] *
                    *(long *)((long)prVar1->random_coeff + uVar500 * 8 + lVar535 + -0x40) +
                    SUB168(auVar70 * auVar318,8);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        local_46f8 = local_46f8 + uVar503;
        local_4708 = local_4708 + (ulong)bVar550;
        if (plVar507[-6] == 0) {
          auVar39._8_8_ = 0;
          auVar39._0_8_ = plVar507[-7];
          auVar287._8_8_ = 0;
          auVar287._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar500 * 8 + lVar535 + -0x38);
          uVar499 = SUB168(auVar39 * auVar287,8);
          uVar503 = SUB168(auVar39 * auVar287,0);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        else {
          auVar71._8_8_ = 0;
          auVar71._0_8_ = plVar507[-7];
          auVar319._8_8_ = 0;
          auVar319._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar500 * 8 + lVar535 + -0x38);
          uVar503 = SUB168(auVar71 * auVar319,0);
          uVar499 = plVar507[-6] *
                    *(long *)((long)prVar1->random_coeff + uVar500 * 8 + lVar535 + -0x38) +
                    SUB168(auVar71 * auVar319,8);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        local_46f8 = local_46f8 + uVar503;
        local_4708 = local_4708 + (ulong)bVar550;
        if (plVar507[-4] == 0) {
          auVar40._8_8_ = 0;
          auVar40._0_8_ = plVar507[-5];
          auVar288._8_8_ = 0;
          auVar288._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar500 * 8 + lVar535 + -0x30);
          uVar499 = SUB168(auVar40 * auVar288,8);
          uVar503 = SUB168(auVar40 * auVar288,0);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        else {
          auVar72._8_8_ = 0;
          auVar72._0_8_ = plVar507[-5];
          auVar320._8_8_ = 0;
          auVar320._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar500 * 8 + lVar535 + -0x30);
          uVar503 = SUB168(auVar72 * auVar320,0);
          uVar499 = plVar507[-4] *
                    *(long *)((long)prVar1->random_coeff + uVar500 * 8 + lVar535 + -0x30) +
                    SUB168(auVar72 * auVar320,8);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        local_46f8 = local_46f8 + uVar503;
        local_4708 = local_4708 + (ulong)bVar550;
        if (plVar507[-2] == 0) {
          auVar41._8_8_ = 0;
          auVar41._0_8_ = plVar507[-3];
          auVar289._8_8_ = 0;
          auVar289._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar500 * 8 + lVar535 + -0x28);
          uVar499 = SUB168(auVar41 * auVar289,8);
          uVar503 = SUB168(auVar41 * auVar289,0);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        else {
          auVar73._8_8_ = 0;
          auVar73._0_8_ = plVar507[-3];
          auVar321._8_8_ = 0;
          auVar321._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar500 * 8 + lVar535 + -0x28);
          uVar503 = SUB168(auVar73 * auVar321,0);
          uVar499 = plVar507[-2] *
                    *(long *)((long)prVar1->random_coeff + uVar500 * 8 + lVar535 + -0x28) +
                    SUB168(auVar73 * auVar321,8);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        local_46f8 = local_46f8 + uVar503;
        local_4708 = local_4708 + (ulong)bVar550;
        if (*plVar507 == 0) {
          auVar42._8_8_ = 0;
          auVar42._0_8_ = plVar507[-1];
          auVar290._8_8_ = 0;
          auVar290._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar500 * 8 + lVar535 + -0x20);
          uVar499 = SUB168(auVar42 * auVar290,8);
          uVar503 = SUB168(auVar42 * auVar290,0);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        else {
          auVar74._8_8_ = 0;
          auVar74._0_8_ = plVar507[-1];
          auVar322._8_8_ = 0;
          auVar322._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar500 * 8 + lVar535 + -0x20);
          uVar503 = SUB168(auVar74 * auVar322,0);
          uVar499 = *plVar507 *
                    *(long *)((long)prVar1->random_coeff + uVar500 * 8 + lVar535 + -0x20) +
                    SUB168(auVar74 * auVar322,8);
          uVar531 = local_4700 + uVar499;
          bVar550 = CARRY8(local_4700,uVar499) || CARRY8(uVar531,(ulong)CARRY8(local_46f8,uVar503));
          local_4700 = uVar531 + CARRY8(local_46f8,uVar503);
        }
        local_46f8 = local_46f8 + uVar503;
        local_4708 = local_4708 + (ulong)bVar550;
        plVar507 = plVar507 + 0x40;
      }
      auVar75._8_8_ = 0;
      auVar75._0_8_ = local_4700;
      uVar531 = SUB168(auVar75 * ZEXT816(0xd),0);
      uVar500 = SUB168(auVar75 * ZEXT816(0xd),8) * 0xd + 0xd + local_4708 * 0xa9;
      uVar503 = uVar500 + local_46f8;
      uVar499 = uVar503 - uVar531;
      uVar500 = (((ulong)CARRY8(uVar500,local_46f8) + 1) - (ulong)(uVar503 < uVar531)) * -0xd +
                uVar499;
      if ((uVar499 < 0x1a) && (0x19 < uVar500)) {
        bVar550 = 0xfffffffffffffff2 < uVar500;
        uVar500 = uVar500 + 0xd;
        uVar531 = (ulong)bVar550;
      }
      else {
        uVar531 = 0;
      }
      uVar510 = 1 << ((uint)lVar541 & 0x1f);
      if ((uVar534 & uVar510) == 0) {
        auStack_4078[lVar541 + 1] = 0;
        uVar534 = uVar534 | uVar510;
      }
      lVar541 = lVar541 + 1;
      lVar535 = lVar535 + 0x420;
      iVar530 = iVar530 + 0x80;
    }
    puVar528 = puVar528 + 0x400;
  }
  prVar1 = this->curr_rd;
  lVar541 = 0;
  lVar535 = 0;
  uVar531 = 0;
  uVar501 = prVar1->const_term;
  uVar500 = cnt & 0xfffffffffffffc00;
  uVar527 = (uint)cnt;
  uVar510 = uVar527 & 0x3ff;
  for (uVar539 = 0; uVar539 < uVar510 >> 6; uVar539 = uVar539 + 1) {
    auVar76._8_8_ = 0;
    auVar76._0_8_ = *(ulong *)(chars + lVar541 + uVar500);
    auVar323._8_8_ = 0;
    auVar323._0_8_ = *(ulong *)((long)prVar1->random_coeff + lVar541);
    uVar506 = SUB168(auVar76 * auVar323,8);
    uVar503 = SUB168(auVar76 * auVar323,0);
    uVar499 = uVar501 + uVar503;
    uVar503 = (ulong)CARRY8(uVar501,uVar503);
    bVar550 = CARRY8(uVar531,uVar506);
    uVar506 = uVar531 + uVar506;
    uVar518 = uVar506 + uVar503;
    auVar77._8_8_ = 0;
    auVar77._0_8_ = *(ulong *)(chars + lVar541 + uVar500 + 8);
    auVar324._8_8_ = 0;
    auVar324._0_8_ = *(ulong *)((long)prVar1->random_coeff + lVar541 + 8);
    uVar520 = SUB168(auVar77 * auVar324,8);
    uVar501 = SUB168(auVar77 * auVar324,0);
    uVar531 = uVar499 + uVar501;
    uVar499 = (ulong)CARRY8(uVar499,uVar501);
    uVar511 = uVar518 + uVar520;
    uVar542 = uVar511 + uVar499;
    auVar78._8_8_ = 0;
    auVar78._0_8_ = *(ulong *)(chars + lVar541 + uVar500 + 0x10);
    auVar325._8_8_ = 0;
    auVar325._0_8_ = *(ulong *)((long)prVar1->random_coeff + lVar541 + 0x10);
    uVar512 = SUB168(auVar78 * auVar325,8);
    uVar501 = SUB168(auVar78 * auVar325,0);
    uVar536 = uVar531 + uVar501;
    uVar502 = (ulong)CARRY8(uVar531,uVar501);
    uVar523 = uVar542 + uVar512;
    uVar543 = uVar523 + uVar502;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = *(ulong *)(chars + lVar541 + uVar500 + 0x18);
    auVar326._8_8_ = 0;
    auVar326._0_8_ = *(ulong *)((long)prVar1->random_coeff + lVar541 + 0x18);
    uVar513 = SUB168(auVar79 * auVar326,8);
    uVar501 = SUB168(auVar79 * auVar326,0);
    uVar531 = uVar536 + uVar501;
    uVar536 = (ulong)CARRY8(uVar536,uVar501);
    uVar524 = uVar543 + uVar513;
    uVar544 = uVar524 + uVar536;
    auVar80._8_8_ = 0;
    auVar80._0_8_ = *(ulong *)(chars + lVar541 + uVar500 + 0x20);
    auVar327._8_8_ = 0;
    auVar327._0_8_ = *(ulong *)((long)prVar1->random_coeff + lVar541 + 0x20);
    uVar514 = SUB168(auVar80 * auVar327,8);
    uVar501 = SUB168(auVar80 * auVar327,0);
    uVar508 = uVar531 + uVar501;
    uVar504 = (ulong)CARRY8(uVar531,uVar501);
    uVar525 = uVar544 + uVar514;
    uVar545 = uVar525 + uVar504;
    auVar81._8_8_ = 0;
    auVar81._0_8_ = *(ulong *)(chars + lVar541 + uVar500 + 0x28);
    auVar328._8_8_ = 0;
    auVar328._0_8_ = *(ulong *)((long)prVar1->random_coeff + lVar541 + 0x28);
    uVar515 = SUB168(auVar81 * auVar328,8);
    uVar501 = SUB168(auVar81 * auVar328,0);
    uVar531 = uVar508 + uVar501;
    uVar508 = (ulong)CARRY8(uVar508,uVar501);
    uVar526 = uVar545 + uVar515;
    uVar546 = uVar526 + uVar508;
    auVar82._8_8_ = 0;
    auVar82._0_8_ = *(ulong *)(chars + lVar541 + uVar500 + 0x30);
    auVar329._8_8_ = 0;
    auVar329._0_8_ = *(ulong *)((long)prVar1->random_coeff + lVar541 + 0x30);
    uVar516 = SUB168(auVar82 * auVar329,8);
    uVar501 = SUB168(auVar82 * auVar329,0);
    uVar509 = uVar531 + uVar501;
    uVar505 = (ulong)CARRY8(uVar531,uVar501);
    uVar521 = uVar546 + uVar516;
    uVar547 = uVar521 + uVar505;
    auVar83._8_8_ = 0;
    auVar83._0_8_ = *(ulong *)(chars + lVar541 + uVar500 + 0x38);
    auVar330._8_8_ = 0;
    auVar330._0_8_ = *(ulong *)((long)prVar1->random_coeff + lVar541 + 0x38);
    uVar517 = SUB168(auVar83 * auVar330,8);
    uVar531 = SUB168(auVar83 * auVar330,0);
    uVar501 = uVar509 + uVar531;
    uVar509 = (ulong)CARRY8(uVar509,uVar531);
    uVar522 = uVar547 + uVar517;
    uVar531 = uVar522 + uVar509;
    lVar535 = lVar535 + (ulong)(bVar550 || CARRY8(uVar506,uVar503)) +
              (ulong)(CARRY8(uVar518,uVar520) || CARRY8(uVar511,uVar499)) +
              (ulong)(CARRY8(uVar542,uVar512) || CARRY8(uVar523,uVar502)) +
              (ulong)(CARRY8(uVar543,uVar513) || CARRY8(uVar524,uVar536)) +
              (ulong)(CARRY8(uVar544,uVar514) || CARRY8(uVar525,uVar504)) +
              (ulong)(CARRY8(uVar545,uVar515) || CARRY8(uVar526,uVar508)) +
              (ulong)(CARRY8(uVar546,uVar516) || CARRY8(uVar521,uVar505)) +
              (ulong)(CARRY8(uVar547,uVar517) || CARRY8(uVar522,uVar509));
    lVar541 = lVar541 + 0x40;
  }
  uVar549 = uVar510 >> 3;
  uVar539 = uVar549 & 0xfffffff8;
  switch(uVar549 & 7) {
  case 0:
    uVar503 = 1;
    switch(uVar527 & 7) {
    case 0:
      goto switchD_0017fb82_caseD_0;
    case 2:
switchD_0017fb82_caseD_2:
      uVar503 = (ulong)*(ushort *)(chars + (ulong)uVar510 + (uVar500 - 2)) | 0x10000;
      goto switchD_0017fb82_caseD_0;
    case 3:
switchD_0017fb82_caseD_3:
      uVar503 = (ulong)chars[(ulong)uVar510 + (uVar500 - 1)] * 0x10000 + 0x1000000 +
                (ulong)*(ushort *)(chars + (ulong)uVar510 + (uVar500 - 3));
      goto switchD_0017fb82_caseD_0;
    case 4:
switchD_0017fb82_caseD_4:
      uVar503 = (ulong)*(uint *)(chars + (ulong)uVar510 + (uVar500 - 4)) | 0x100000000;
      goto switchD_0017fb82_caseD_0;
    case 5:
switchD_0017fb82_caseD_5:
      uVar503 = (ulong)CONCAT14(chars[(ulong)uVar510 + (uVar500 - 1)],
                                *(undefined4 *)(chars + (ulong)uVar510 + (uVar500 - 5))) |
                0x10000000000;
      goto switchD_0017fb82_caseD_0;
    case 6:
switchD_0017fb82_caseD_6:
      uVar503 = (ulong)CONCAT24(*(undefined2 *)(chars + (ulong)uVar510 + (uVar500 - 2)),
                                *(undefined4 *)(chars + (ulong)uVar510 + (uVar500 - 6))) |
                0x1000000000000;
      goto switchD_0017fb82_caseD_0;
    case 7:
switchD_0017fb82_caseD_7:
      uVar503 = (ulong)CONCAT16(chars[(ulong)uVar510 + (uVar500 - 1)],
                                CONCAT24(*(undefined2 *)(chars + (ulong)uVar510 + (uVar500 - 3)),
                                         *(undefined4 *)(chars + (ulong)uVar510 + (uVar500 - 7)))) |
                0x100000000000000;
      goto switchD_0017fb82_caseD_0;
    }
    break;
  case 1:
    auVar100._8_8_ = 0;
    auVar100._0_8_ = *(ulong *)(chars + (uVar539 << 3) + uVar500);
    auVar347._8_8_ = 0;
    auVar347._0_8_ = *(ulong *)((long)prVar1->random_coeff + (ulong)(uVar539 << 3));
    uVar499 = SUB168(auVar100 * auVar347,8);
    uVar503 = SUB168(auVar100 * auVar347,0);
    bVar550 = CARRY8(uVar501,uVar503);
    uVar501 = uVar501 + uVar503;
    uVar503 = (ulong)bVar550;
    bVar550 = CARRY8(uVar531,uVar499);
    uVar499 = uVar531 + uVar499;
    uVar531 = uVar499 + uVar503;
    lVar535 = lVar535 + (ulong)(bVar550 || CARRY8(uVar499,uVar503));
    uVar503 = 1;
    switch(uVar527 & 7) {
    case 0:
      goto switchD_0017fb82_caseD_0;
    case 2:
      goto switchD_0017fb82_caseD_2;
    case 3:
      goto switchD_0017fb82_caseD_3;
    case 4:
      goto switchD_0017fb82_caseD_4;
    case 5:
      goto switchD_0017fb82_caseD_5;
    case 6:
      goto switchD_0017fb82_caseD_6;
    case 7:
      goto switchD_0017fb82_caseD_7;
    }
    break;
  case 2:
    uVar539 = uVar539 << 3;
    auVar88._8_8_ = 0;
    auVar88._0_8_ = *(ulong *)(chars + uVar539 + uVar500);
    auVar335._8_8_ = 0;
    auVar335._0_8_ = *(ulong *)((long)prVar1->random_coeff + (ulong)uVar539);
    uVar502 = SUB168(auVar88 * auVar335,8);
    uVar503 = SUB168(auVar88 * auVar335,0);
    uVar499 = uVar501 + uVar503;
    uVar503 = (ulong)CARRY8(uVar501,uVar503);
    bVar550 = CARRY8(uVar531,uVar502);
    uVar502 = uVar531 + uVar502;
    uVar508 = uVar502 + uVar503;
    auVar89._8_8_ = 0;
    auVar89._0_8_ = *(ulong *)(chars + (uVar539 | 8) + uVar500);
    auVar336._8_8_ = 0;
    auVar336._0_8_ = *(ulong *)((long)prVar1->random_coeff + (ulong)(uVar539 | 8));
    uVar504 = SUB168(auVar89 * auVar336,8);
    uVar531 = SUB168(auVar89 * auVar336,0);
    uVar501 = uVar499 + uVar531;
    uVar499 = (ulong)CARRY8(uVar499,uVar531);
    uVar536 = uVar508 + uVar504;
    uVar531 = uVar536 + uVar499;
    lVar535 = lVar535 + (ulong)(bVar550 || CARRY8(uVar502,uVar503)) +
              (ulong)(CARRY8(uVar508,uVar504) || CARRY8(uVar536,uVar499));
    uVar503 = 1;
    switch(uVar527 & 7) {
    case 0:
      goto switchD_0017fb82_caseD_0;
    case 2:
      goto switchD_0017fb82_caseD_2;
    case 3:
      goto switchD_0017fb82_caseD_3;
    case 4:
      goto switchD_0017fb82_caseD_4;
    case 5:
      goto switchD_0017fb82_caseD_5;
    case 6:
      goto switchD_0017fb82_caseD_6;
    case 7:
      goto switchD_0017fb82_caseD_7;
    }
    break;
  case 3:
    uVar539 = uVar539 << 3;
    auVar90._8_8_ = 0;
    auVar90._0_8_ = *(ulong *)(chars + uVar539 + uVar500);
    auVar337._8_8_ = 0;
    auVar337._0_8_ = *(ulong *)((long)prVar1->random_coeff + (ulong)uVar539);
    uVar536 = SUB168(auVar90 * auVar337,8);
    uVar503 = SUB168(auVar90 * auVar337,0);
    uVar499 = uVar501 + uVar503;
    uVar503 = (ulong)CARRY8(uVar501,uVar503);
    bVar550 = CARRY8(uVar531,uVar536);
    uVar536 = uVar531 + uVar536;
    uVar506 = uVar536 + uVar503;
    auVar91._8_8_ = 0;
    auVar91._0_8_ = *(ulong *)(chars + (uVar539 | 8) + uVar500);
    auVar338._8_8_ = 0;
    auVar338._0_8_ = *(ulong *)((long)prVar1->random_coeff + (ulong)(uVar539 | 8));
    uVar505 = SUB168(auVar91 * auVar338,8);
    uVar501 = SUB168(auVar91 * auVar338,0);
    uVar502 = uVar499 + uVar501;
    uVar499 = (ulong)CARRY8(uVar499,uVar501);
    uVar504 = uVar506 + uVar505;
    uVar511 = uVar504 + uVar499;
    auVar92._8_8_ = 0;
    auVar92._0_8_ = *(ulong *)(chars + (uVar539 | 0x10) + uVar500);
    auVar339._8_8_ = 0;
    auVar339._0_8_ = *(ulong *)((long)prVar1->random_coeff + (ulong)(uVar539 | 0x10));
    uVar509 = SUB168(auVar92 * auVar339,8);
    uVar531 = SUB168(auVar92 * auVar339,0);
    uVar501 = uVar502 + uVar531;
    uVar502 = (ulong)CARRY8(uVar502,uVar531);
    uVar508 = uVar511 + uVar509;
    uVar531 = uVar508 + uVar502;
    lVar535 = lVar535 + (ulong)(bVar550 || CARRY8(uVar536,uVar503)) +
              (ulong)(CARRY8(uVar506,uVar505) || CARRY8(uVar504,uVar499)) +
              (ulong)(CARRY8(uVar511,uVar509) || CARRY8(uVar508,uVar502));
    uVar503 = 1;
    switch(uVar527 & 7) {
    case 0:
      goto switchD_0017fb82_caseD_0;
    case 2:
      goto switchD_0017fb82_caseD_2;
    case 3:
      goto switchD_0017fb82_caseD_3;
    case 4:
      goto switchD_0017fb82_caseD_4;
    case 5:
      goto switchD_0017fb82_caseD_5;
    case 6:
      goto switchD_0017fb82_caseD_6;
    case 7:
      goto switchD_0017fb82_caseD_7;
    }
    break;
  case 4:
    uVar539 = uVar539 << 3;
    auVar84._8_8_ = 0;
    auVar84._0_8_ = *(ulong *)(chars + uVar539 + uVar500);
    auVar331._8_8_ = 0;
    auVar331._0_8_ = *(ulong *)((long)prVar1->random_coeff + (ulong)uVar539);
    uVar504 = SUB168(auVar84 * auVar331,8);
    uVar503 = SUB168(auVar84 * auVar331,0);
    uVar499 = uVar501 + uVar503;
    uVar503 = (ulong)CARRY8(uVar501,uVar503);
    bVar550 = CARRY8(uVar531,uVar504);
    uVar504 = uVar531 + uVar504;
    uVar524 = uVar504 + uVar503;
    auVar85._8_8_ = 0;
    auVar85._0_8_ = *(ulong *)(chars + (uVar539 | 8) + uVar500);
    auVar332._8_8_ = 0;
    auVar332._0_8_ = *(ulong *)((long)prVar1->random_coeff + (ulong)(uVar539 | 8));
    uVar506 = SUB168(auVar85 * auVar332,8);
    uVar501 = SUB168(auVar85 * auVar332,0);
    uVar531 = uVar499 + uVar501;
    uVar499 = (ulong)CARRY8(uVar499,uVar501);
    uVar508 = uVar524 + uVar506;
    uVar525 = uVar508 + uVar499;
    auVar86._8_8_ = 0;
    auVar86._0_8_ = *(ulong *)(chars + (uVar539 | 0x10) + uVar500);
    auVar333._8_8_ = 0;
    auVar333._0_8_ = *(ulong *)((long)prVar1->random_coeff + (ulong)(uVar539 | 0x10));
    uVar511 = SUB168(auVar86 * auVar333,8);
    uVar501 = SUB168(auVar86 * auVar333,0);
    uVar536 = uVar531 + uVar501;
    uVar502 = (ulong)CARRY8(uVar531,uVar501);
    uVar505 = uVar525 + uVar511;
    uVar526 = uVar505 + uVar502;
    auVar87._8_8_ = 0;
    auVar87._0_8_ = *(ulong *)(chars + (uVar539 | 0x18) + uVar500);
    auVar334._8_8_ = 0;
    auVar334._0_8_ = *(ulong *)((long)prVar1->random_coeff + (ulong)(uVar539 | 0x18));
    uVar523 = SUB168(auVar87 * auVar334,8);
    uVar531 = SUB168(auVar87 * auVar334,0);
    uVar501 = uVar536 + uVar531;
    uVar536 = (ulong)CARRY8(uVar536,uVar531);
    uVar509 = uVar526 + uVar523;
    uVar531 = uVar509 + uVar536;
    lVar535 = lVar535 + (ulong)(bVar550 || CARRY8(uVar504,uVar503)) +
              (ulong)(CARRY8(uVar524,uVar506) || CARRY8(uVar508,uVar499)) +
              (ulong)(CARRY8(uVar525,uVar511) || CARRY8(uVar505,uVar502)) +
              (ulong)(CARRY8(uVar526,uVar523) || CARRY8(uVar509,uVar536));
    uVar503 = 1;
    switch(uVar527 & 7) {
    case 0:
      goto switchD_0017fb82_caseD_0;
    case 2:
      goto switchD_0017fb82_caseD_2;
    case 3:
      goto switchD_0017fb82_caseD_3;
    case 4:
      goto switchD_0017fb82_caseD_4;
    case 5:
      goto switchD_0017fb82_caseD_5;
    case 6:
      goto switchD_0017fb82_caseD_6;
    case 7:
      goto switchD_0017fb82_caseD_7;
    }
    break;
  case 5:
    uVar539 = uVar539 << 3;
    auVar101._8_8_ = 0;
    auVar101._0_8_ = *(ulong *)(chars + uVar539 + uVar500);
    auVar348._8_8_ = 0;
    auVar348._0_8_ = *(ulong *)((long)prVar1->random_coeff + (ulong)uVar539);
    uVar508 = SUB168(auVar101 * auVar348,8);
    uVar503 = SUB168(auVar101 * auVar348,0);
    uVar499 = uVar501 + uVar503;
    uVar503 = (ulong)CARRY8(uVar501,uVar503);
    bVar550 = CARRY8(uVar531,uVar508);
    uVar508 = uVar531 + uVar508;
    uVar521 = uVar508 + uVar503;
    auVar102._8_8_ = 0;
    auVar102._0_8_ = *(ulong *)(chars + (uVar539 | 8) + uVar500);
    auVar349._8_8_ = 0;
    auVar349._0_8_ = *(ulong *)((long)prVar1->random_coeff + (ulong)(uVar539 | 8));
    uVar523 = SUB168(auVar102 * auVar349,8);
    uVar501 = SUB168(auVar102 * auVar349,0);
    uVar531 = uVar499 + uVar501;
    uVar499 = (ulong)CARRY8(uVar499,uVar501);
    uVar505 = uVar521 + uVar523;
    uVar522 = uVar505 + uVar499;
    auVar103._8_8_ = 0;
    auVar103._0_8_ = *(ulong *)(chars + (uVar539 | 0x10) + uVar500);
    auVar350._8_8_ = 0;
    auVar350._0_8_ = *(ulong *)((long)prVar1->random_coeff + (ulong)(uVar539 | 0x10));
    uVar524 = SUB168(auVar103 * auVar350,8);
    uVar501 = SUB168(auVar103 * auVar350,0);
    uVar536 = uVar531 + uVar501;
    uVar502 = (ulong)CARRY8(uVar531,uVar501);
    uVar509 = uVar522 + uVar524;
    uVar520 = uVar509 + uVar502;
    auVar104._8_8_ = 0;
    auVar104._0_8_ = *(ulong *)(chars + (uVar539 | 0x18) + uVar500);
    auVar351._8_8_ = 0;
    auVar351._0_8_ = *(ulong *)((long)prVar1->random_coeff + (ulong)(uVar539 | 0x18));
    uVar525 = SUB168(auVar104 * auVar351,8);
    uVar501 = SUB168(auVar104 * auVar351,0);
    uVar504 = uVar536 + uVar501;
    uVar536 = (ulong)CARRY8(uVar536,uVar501);
    uVar506 = uVar520 + uVar525;
    uVar512 = uVar506 + uVar536;
    auVar105._8_8_ = 0;
    auVar105._0_8_ = *(ulong *)(chars + (uVar539 | 0x20) + uVar500);
    auVar352._8_8_ = 0;
    auVar352._0_8_ = *(ulong *)((long)prVar1->random_coeff + (ulong)(uVar539 | 0x20));
    uVar526 = SUB168(auVar105 * auVar352,8);
    uVar531 = SUB168(auVar105 * auVar352,0);
    uVar501 = uVar504 + uVar531;
    uVar504 = (ulong)CARRY8(uVar504,uVar531);
    uVar511 = uVar512 + uVar526;
    uVar531 = uVar511 + uVar504;
    lVar535 = lVar535 + (ulong)(bVar550 || CARRY8(uVar508,uVar503)) +
              (ulong)(CARRY8(uVar521,uVar523) || CARRY8(uVar505,uVar499)) +
              (ulong)(CARRY8(uVar522,uVar524) || CARRY8(uVar509,uVar502)) +
              (ulong)(CARRY8(uVar520,uVar525) || CARRY8(uVar506,uVar536)) +
              (ulong)(CARRY8(uVar512,uVar526) || CARRY8(uVar511,uVar504));
    uVar503 = 1;
    switch(uVar527 & 7) {
    case 0:
      goto switchD_0017fb82_caseD_0;
    case 2:
      goto switchD_0017fb82_caseD_2;
    case 3:
      goto switchD_0017fb82_caseD_3;
    case 4:
      goto switchD_0017fb82_caseD_4;
    case 5:
      goto switchD_0017fb82_caseD_5;
    case 6:
      goto switchD_0017fb82_caseD_6;
    case 7:
      goto switchD_0017fb82_caseD_7;
    }
    break;
  case 6:
    uVar539 = uVar539 << 3;
    auVar106._8_8_ = 0;
    auVar106._0_8_ = *(ulong *)(chars + uVar539 + uVar500);
    auVar353._8_8_ = 0;
    auVar353._0_8_ = *(ulong *)((long)prVar1->random_coeff + (ulong)uVar539);
    uVar505 = SUB168(auVar106 * auVar353,8);
    uVar503 = SUB168(auVar106 * auVar353,0);
    uVar499 = uVar501 + uVar503;
    uVar503 = (ulong)CARRY8(uVar501,uVar503);
    bVar550 = CARRY8(uVar531,uVar505);
    uVar505 = uVar531 + uVar505;
    uVar512 = uVar505 + uVar503;
    auVar107._8_8_ = 0;
    auVar107._0_8_ = *(ulong *)(chars + (uVar539 | 8) + uVar500);
    auVar354._8_8_ = 0;
    auVar354._0_8_ = *(ulong *)((long)prVar1->random_coeff + (ulong)(uVar539 | 8));
    uVar525 = SUB168(auVar107 * auVar354,8);
    uVar501 = SUB168(auVar107 * auVar354,0);
    uVar531 = uVar499 + uVar501;
    uVar499 = (ulong)CARRY8(uVar499,uVar501);
    uVar509 = uVar512 + uVar525;
    uVar513 = uVar509 + uVar499;
    auVar108._8_8_ = 0;
    auVar108._0_8_ = *(ulong *)(chars + (uVar539 | 0x10) + uVar500);
    auVar355._8_8_ = 0;
    auVar355._0_8_ = *(ulong *)((long)prVar1->random_coeff + (ulong)(uVar539 | 0x10));
    uVar526 = SUB168(auVar108 * auVar355,8);
    uVar501 = SUB168(auVar108 * auVar355,0);
    uVar536 = uVar531 + uVar501;
    uVar502 = (ulong)CARRY8(uVar531,uVar501);
    uVar506 = uVar513 + uVar526;
    uVar514 = uVar506 + uVar502;
    auVar109._8_8_ = 0;
    auVar109._0_8_ = *(ulong *)(chars + (uVar539 | 0x18) + uVar500);
    auVar356._8_8_ = 0;
    auVar356._0_8_ = *(ulong *)((long)prVar1->random_coeff + (ulong)(uVar539 | 0x18));
    uVar521 = SUB168(auVar109 * auVar356,8);
    uVar501 = SUB168(auVar109 * auVar356,0);
    uVar531 = uVar536 + uVar501;
    uVar536 = (ulong)CARRY8(uVar536,uVar501);
    uVar511 = uVar514 + uVar521;
    uVar515 = uVar511 + uVar536;
    auVar110._8_8_ = 0;
    auVar110._0_8_ = *(ulong *)(chars + (uVar539 | 0x20) + uVar500);
    auVar357._8_8_ = 0;
    auVar357._0_8_ = *(ulong *)((long)prVar1->random_coeff + (ulong)(uVar539 | 0x20));
    uVar522 = SUB168(auVar110 * auVar357,8);
    uVar501 = SUB168(auVar110 * auVar357,0);
    uVar508 = uVar531 + uVar501;
    uVar504 = (ulong)CARRY8(uVar531,uVar501);
    uVar523 = uVar515 + uVar522;
    uVar516 = uVar523 + uVar504;
    auVar111._8_8_ = 0;
    auVar111._0_8_ = *(ulong *)(chars + (uVar539 | 0x28) + uVar500);
    auVar358._8_8_ = 0;
    auVar358._0_8_ = *(ulong *)((long)prVar1->random_coeff + (ulong)(uVar539 | 0x28));
    uVar520 = SUB168(auVar111 * auVar358,8);
    uVar531 = SUB168(auVar111 * auVar358,0);
    uVar501 = uVar508 + uVar531;
    uVar508 = (ulong)CARRY8(uVar508,uVar531);
    uVar524 = uVar516 + uVar520;
    uVar531 = uVar524 + uVar508;
    lVar535 = lVar535 + (ulong)(bVar550 || CARRY8(uVar505,uVar503)) +
              (ulong)(CARRY8(uVar512,uVar525) || CARRY8(uVar509,uVar499)) +
              (ulong)(CARRY8(uVar513,uVar526) || CARRY8(uVar506,uVar502)) +
              (ulong)(CARRY8(uVar514,uVar521) || CARRY8(uVar511,uVar536)) +
              (ulong)(CARRY8(uVar515,uVar522) || CARRY8(uVar523,uVar504)) +
              (ulong)(CARRY8(uVar516,uVar520) || CARRY8(uVar524,uVar508));
    uVar503 = 1;
    switch(uVar527 & 7) {
    case 0:
      goto switchD_0017fb82_caseD_0;
    case 2:
      goto switchD_0017fb82_caseD_2;
    case 3:
      goto switchD_0017fb82_caseD_3;
    case 4:
      goto switchD_0017fb82_caseD_4;
    case 5:
      goto switchD_0017fb82_caseD_5;
    case 6:
      goto switchD_0017fb82_caseD_6;
    case 7:
      goto switchD_0017fb82_caseD_7;
    }
    break;
  case 7:
    uVar539 = uVar539 << 3;
    auVar93._8_8_ = 0;
    auVar93._0_8_ = *(ulong *)(chars + uVar539 + uVar500);
    auVar340._8_8_ = 0;
    auVar340._0_8_ = *(ulong *)((long)prVar1->random_coeff + (ulong)uVar539);
    uVar509 = SUB168(auVar93 * auVar340,8);
    uVar503 = SUB168(auVar93 * auVar340,0);
    uVar499 = uVar501 + uVar503;
    uVar503 = (ulong)CARRY8(uVar501,uVar503);
    bVar550 = CARRY8(uVar531,uVar509);
    uVar509 = uVar531 + uVar509;
    uVar515 = uVar509 + uVar503;
    auVar94._8_8_ = 0;
    auVar94._0_8_ = *(ulong *)(chars + (uVar539 | 8) + uVar500);
    auVar341._8_8_ = 0;
    auVar341._0_8_ = *(ulong *)((long)prVar1->random_coeff + (ulong)(uVar539 | 8));
    uVar521 = SUB168(auVar94 * auVar341,8);
    uVar501 = SUB168(auVar94 * auVar341,0);
    uVar531 = uVar499 + uVar501;
    uVar499 = (ulong)CARRY8(uVar499,uVar501);
    uVar506 = uVar515 + uVar521;
    uVar516 = uVar506 + uVar499;
    auVar95._8_8_ = 0;
    auVar95._0_8_ = *(ulong *)(chars + (uVar539 | 0x10) + uVar500);
    auVar342._8_8_ = 0;
    auVar342._0_8_ = *(ulong *)((long)prVar1->random_coeff + (ulong)(uVar539 | 0x10));
    uVar522 = SUB168(auVar95 * auVar342,8);
    uVar501 = SUB168(auVar95 * auVar342,0);
    uVar536 = uVar531 + uVar501;
    uVar502 = (ulong)CARRY8(uVar531,uVar501);
    uVar511 = uVar516 + uVar522;
    uVar517 = uVar511 + uVar502;
    auVar96._8_8_ = 0;
    auVar96._0_8_ = *(ulong *)(chars + (uVar539 | 0x18) + uVar500);
    auVar343._8_8_ = 0;
    auVar343._0_8_ = *(ulong *)((long)prVar1->random_coeff + (ulong)(uVar539 | 0x18));
    uVar520 = SUB168(auVar96 * auVar343,8);
    uVar501 = SUB168(auVar96 * auVar343,0);
    uVar531 = uVar536 + uVar501;
    uVar536 = (ulong)CARRY8(uVar536,uVar501);
    uVar523 = uVar517 + uVar520;
    uVar518 = uVar523 + uVar536;
    auVar97._8_8_ = 0;
    auVar97._0_8_ = *(ulong *)(chars + (uVar539 | 0x20) + uVar500);
    auVar344._8_8_ = 0;
    auVar344._0_8_ = *(ulong *)((long)prVar1->random_coeff + (ulong)(uVar539 | 0x20));
    uVar512 = SUB168(auVar97 * auVar344,8);
    uVar501 = SUB168(auVar97 * auVar344,0);
    uVar508 = uVar531 + uVar501;
    uVar504 = (ulong)CARRY8(uVar531,uVar501);
    uVar524 = uVar518 + uVar512;
    uVar542 = uVar524 + uVar504;
    auVar98._8_8_ = 0;
    auVar98._0_8_ = *(ulong *)(chars + (uVar539 | 0x28) + uVar500);
    auVar345._8_8_ = 0;
    auVar345._0_8_ = *(ulong *)((long)prVar1->random_coeff + (ulong)(uVar539 | 0x28));
    uVar513 = SUB168(auVar98 * auVar345,8);
    uVar501 = SUB168(auVar98 * auVar345,0);
    uVar505 = uVar508 + uVar501;
    uVar508 = (ulong)CARRY8(uVar508,uVar501);
    uVar525 = uVar542 + uVar513;
    uVar543 = uVar525 + uVar508;
    auVar99._8_8_ = 0;
    auVar99._0_8_ = *(ulong *)(chars + (uVar539 | 0x30) + uVar500);
    auVar346._8_8_ = 0;
    auVar346._0_8_ = *(ulong *)((long)prVar1->random_coeff + (ulong)(uVar539 | 0x30));
    uVar514 = SUB168(auVar99 * auVar346,8);
    uVar531 = SUB168(auVar99 * auVar346,0);
    uVar501 = uVar505 + uVar531;
    uVar505 = (ulong)CARRY8(uVar505,uVar531);
    uVar526 = uVar543 + uVar514;
    uVar531 = uVar526 + uVar505;
    lVar535 = lVar535 + (ulong)(bVar550 || CARRY8(uVar509,uVar503)) +
              (ulong)(CARRY8(uVar515,uVar521) || CARRY8(uVar506,uVar499)) +
              (ulong)(CARRY8(uVar516,uVar522) || CARRY8(uVar511,uVar502)) +
              (ulong)(CARRY8(uVar517,uVar520) || CARRY8(uVar523,uVar536)) +
              (ulong)(CARRY8(uVar518,uVar512) || CARRY8(uVar524,uVar504)) +
              (ulong)(CARRY8(uVar542,uVar513) || CARRY8(uVar525,uVar508)) +
              (ulong)(CARRY8(uVar543,uVar514) || CARRY8(uVar526,uVar505));
    uVar503 = 1;
    switch(uVar527 & 7) {
    case 0:
      goto switchD_0017fb82_caseD_0;
    case 2:
      goto switchD_0017fb82_caseD_2;
    case 3:
      goto switchD_0017fb82_caseD_3;
    case 4:
      goto switchD_0017fb82_caseD_4;
    case 5:
      goto switchD_0017fb82_caseD_5;
    case 6:
      goto switchD_0017fb82_caseD_6;
    case 7:
      goto switchD_0017fb82_caseD_7;
    }
  }
  uVar503 = (ulong)chars[(ulong)uVar510 + (uVar500 - 1)] | 0x100;
switchD_0017fb82_caseD_0:
  auVar112._8_8_ = 0;
  auVar112._0_8_ = uVar503;
  auVar359._8_8_ = 0;
  auVar359._0_8_ = prVar1->random_coeff[uVar549];
  uVar502 = SUB168(auVar112 * auVar359,8);
  uVar500 = SUB168(auVar112 * auVar359,0);
  uVar499 = uVar501 + uVar500;
  uVar501 = (ulong)CARRY8(uVar501,uVar500);
  uVar500 = uVar531 + uVar502;
  auVar113._8_8_ = 0;
  auVar113._0_8_ = uVar500 + uVar501;
  uVar503 = SUB168(auVar113 * ZEXT816(0xd),0);
  uVar501 = (lVar535 + (ulong)(CARRY8(uVar531,uVar502) || CARRY8(uVar500,uVar501))) * 0xa9 + 0xd +
            SUB168(auVar113 * ZEXT816(0xd),8) * 0xd;
  uVar500 = 0;
  uVar531 = uVar501 + uVar499;
  uVar502 = uVar531 - uVar503;
  uVar501 = (((ulong)CARRY8(uVar501,uVar499) + 1) - (ulong)(uVar531 < uVar503)) * -0xd + uVar502;
  if ((uVar502 < 0x1a) && (uVar500 = 0, 0x19 < uVar501)) {
    bVar550 = 0xfffffffffffffff2 < uVar501;
    uVar501 = uVar501 + 0xd;
    uVar500 = (ulong)bVar550;
  }
  lVar535 = 1;
  lVar541 = 0x538;
  iVar530 = 0x80;
  while( true ) {
    uVar531 = auStack_4078[lVar535];
    lVar519 = (long)(int)((uint)lVar535 << 7);
    auStack_4078[lVar535] = uVar531 + 1;
    auStack_4038[uVar531 * 2 + lVar519 * 2] = uVar501;
    auStack_4038[uVar531 * 2 + lVar519 * 2 + 1] = uVar500;
    if (uVar531 + 1 != 0x80) break;
    auStack_4078[lVar535] = 0;
    prVar1 = this->curr_rd;
    plVar507 = local_3e40 + (long)iVar530 * 2;
    local_46f8 = prVar1[lVar535].const_term;
    local_4700 = 0;
    local_4708 = 0;
    for (uVar501 = 0; uVar501 < 0x80; uVar501 = uVar501 + 0x20) {
      if (plVar507[-0x3e] == 0) {
        auVar114._8_8_ = 0;
        auVar114._0_8_ = plVar507[-0x3f];
        auVar360._8_8_ = 0;
        auVar360._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar541 + -0xf8);
        uVar503 = SUB168(auVar114 * auVar360,8);
        uVar531 = SUB168(auVar114 * auVar360,0);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      else {
        auVar146._8_8_ = 0;
        auVar146._0_8_ = plVar507[-0x3f];
        auVar392._8_8_ = 0;
        auVar392._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar541 + -0xf8);
        uVar531 = SUB168(auVar146 * auVar392,0);
        uVar503 = plVar507[-0x3e] * *(long *)((long)prVar1 + uVar501 * 8 + lVar541 + -0xf8) +
                  SUB168(auVar146 * auVar392,8);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      local_46f8 = local_46f8 + uVar531;
      local_4708 = local_4708 + (ulong)bVar550;
      if (plVar507[-0x3c] == 0) {
        auVar115._8_8_ = 0;
        auVar115._0_8_ = plVar507[-0x3d];
        auVar361._8_8_ = 0;
        auVar361._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar541 + -0xf0);
        uVar503 = SUB168(auVar115 * auVar361,8);
        uVar531 = SUB168(auVar115 * auVar361,0);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      else {
        auVar147._8_8_ = 0;
        auVar147._0_8_ = plVar507[-0x3d];
        auVar393._8_8_ = 0;
        auVar393._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar541 + -0xf0);
        uVar531 = SUB168(auVar147 * auVar393,0);
        uVar503 = plVar507[-0x3c] * *(long *)((long)prVar1 + uVar501 * 8 + lVar541 + -0xf0) +
                  SUB168(auVar147 * auVar393,8);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      local_46f8 = local_46f8 + uVar531;
      local_4708 = local_4708 + (ulong)bVar550;
      if (plVar507[-0x3a] == 0) {
        auVar116._8_8_ = 0;
        auVar116._0_8_ = plVar507[-0x3b];
        auVar362._8_8_ = 0;
        auVar362._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar541 + -0xe8);
        uVar503 = SUB168(auVar116 * auVar362,8);
        uVar531 = SUB168(auVar116 * auVar362,0);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      else {
        auVar148._8_8_ = 0;
        auVar148._0_8_ = plVar507[-0x3b];
        auVar394._8_8_ = 0;
        auVar394._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar541 + -0xe8);
        uVar531 = SUB168(auVar148 * auVar394,0);
        uVar503 = plVar507[-0x3a] * *(long *)((long)prVar1 + uVar501 * 8 + lVar541 + -0xe8) +
                  SUB168(auVar148 * auVar394,8);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      local_46f8 = local_46f8 + uVar531;
      local_4708 = local_4708 + (ulong)bVar550;
      if (plVar507[-0x38] == 0) {
        auVar117._8_8_ = 0;
        auVar117._0_8_ = plVar507[-0x39];
        auVar363._8_8_ = 0;
        auVar363._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar541 + -0xe0);
        uVar503 = SUB168(auVar117 * auVar363,8);
        uVar531 = SUB168(auVar117 * auVar363,0);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      else {
        auVar149._8_8_ = 0;
        auVar149._0_8_ = plVar507[-0x39];
        auVar395._8_8_ = 0;
        auVar395._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar541 + -0xe0);
        uVar531 = SUB168(auVar149 * auVar395,0);
        uVar503 = plVar507[-0x38] * *(long *)((long)prVar1 + uVar501 * 8 + lVar541 + -0xe0) +
                  SUB168(auVar149 * auVar395,8);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      local_46f8 = local_46f8 + uVar531;
      local_4708 = local_4708 + (ulong)bVar550;
      if (plVar507[-0x36] == 0) {
        auVar118._8_8_ = 0;
        auVar118._0_8_ = plVar507[-0x37];
        auVar364._8_8_ = 0;
        auVar364._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar541 + -0xd8);
        uVar503 = SUB168(auVar118 * auVar364,8);
        uVar531 = SUB168(auVar118 * auVar364,0);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      else {
        auVar150._8_8_ = 0;
        auVar150._0_8_ = plVar507[-0x37];
        auVar396._8_8_ = 0;
        auVar396._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar541 + -0xd8);
        uVar531 = SUB168(auVar150 * auVar396,0);
        uVar503 = plVar507[-0x36] * *(long *)((long)prVar1 + uVar501 * 8 + lVar541 + -0xd8) +
                  SUB168(auVar150 * auVar396,8);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      local_46f8 = local_46f8 + uVar531;
      local_4708 = local_4708 + (ulong)bVar550;
      if (plVar507[-0x34] == 0) {
        auVar119._8_8_ = 0;
        auVar119._0_8_ = plVar507[-0x35];
        auVar365._8_8_ = 0;
        auVar365._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar541 + -0xd0);
        uVar503 = SUB168(auVar119 * auVar365,8);
        uVar531 = SUB168(auVar119 * auVar365,0);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      else {
        auVar151._8_8_ = 0;
        auVar151._0_8_ = plVar507[-0x35];
        auVar397._8_8_ = 0;
        auVar397._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar541 + -0xd0);
        uVar531 = SUB168(auVar151 * auVar397,0);
        uVar503 = plVar507[-0x34] * *(long *)((long)prVar1 + uVar501 * 8 + lVar541 + -0xd0) +
                  SUB168(auVar151 * auVar397,8);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      local_46f8 = local_46f8 + uVar531;
      local_4708 = local_4708 + (ulong)bVar550;
      if (plVar507[-0x32] == 0) {
        auVar120._8_8_ = 0;
        auVar120._0_8_ = plVar507[-0x33];
        auVar366._8_8_ = 0;
        auVar366._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar541 + -200);
        uVar503 = SUB168(auVar120 * auVar366,8);
        uVar531 = SUB168(auVar120 * auVar366,0);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      else {
        auVar152._8_8_ = 0;
        auVar152._0_8_ = plVar507[-0x33];
        auVar398._8_8_ = 0;
        auVar398._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar541 + -200);
        uVar531 = SUB168(auVar152 * auVar398,0);
        uVar503 = plVar507[-0x32] * *(long *)((long)prVar1 + uVar501 * 8 + lVar541 + -200) +
                  SUB168(auVar152 * auVar398,8);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      local_46f8 = local_46f8 + uVar531;
      local_4708 = local_4708 + (ulong)bVar550;
      if (plVar507[-0x30] == 0) {
        auVar121._8_8_ = 0;
        auVar121._0_8_ = plVar507[-0x31];
        auVar367._8_8_ = 0;
        auVar367._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar541 + -0xc0);
        uVar503 = SUB168(auVar121 * auVar367,8);
        uVar531 = SUB168(auVar121 * auVar367,0);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      else {
        auVar153._8_8_ = 0;
        auVar153._0_8_ = plVar507[-0x31];
        auVar399._8_8_ = 0;
        auVar399._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar541 + -0xc0);
        uVar531 = SUB168(auVar153 * auVar399,0);
        uVar503 = plVar507[-0x30] * *(long *)((long)prVar1 + uVar501 * 8 + lVar541 + -0xc0) +
                  SUB168(auVar153 * auVar399,8);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      local_46f8 = local_46f8 + uVar531;
      local_4708 = local_4708 + (ulong)bVar550;
      if (plVar507[-0x2e] == 0) {
        auVar122._8_8_ = 0;
        auVar122._0_8_ = plVar507[-0x2f];
        auVar368._8_8_ = 0;
        auVar368._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar541 + -0xb8);
        uVar503 = SUB168(auVar122 * auVar368,8);
        uVar531 = SUB168(auVar122 * auVar368,0);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      else {
        auVar154._8_8_ = 0;
        auVar154._0_8_ = plVar507[-0x2f];
        auVar400._8_8_ = 0;
        auVar400._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar541 + -0xb8);
        uVar531 = SUB168(auVar154 * auVar400,0);
        uVar503 = plVar507[-0x2e] * *(long *)((long)prVar1 + uVar501 * 8 + lVar541 + -0xb8) +
                  SUB168(auVar154 * auVar400,8);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      local_46f8 = local_46f8 + uVar531;
      local_4708 = local_4708 + (ulong)bVar550;
      if (plVar507[-0x2c] == 0) {
        auVar123._8_8_ = 0;
        auVar123._0_8_ = plVar507[-0x2d];
        auVar369._8_8_ = 0;
        auVar369._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar541 + -0xb0);
        uVar503 = SUB168(auVar123 * auVar369,8);
        uVar531 = SUB168(auVar123 * auVar369,0);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      else {
        auVar155._8_8_ = 0;
        auVar155._0_8_ = plVar507[-0x2d];
        auVar401._8_8_ = 0;
        auVar401._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar541 + -0xb0);
        uVar531 = SUB168(auVar155 * auVar401,0);
        uVar503 = plVar507[-0x2c] * *(long *)((long)prVar1 + uVar501 * 8 + lVar541 + -0xb0) +
                  SUB168(auVar155 * auVar401,8);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      local_46f8 = local_46f8 + uVar531;
      local_4708 = local_4708 + (ulong)bVar550;
      if (plVar507[-0x2a] == 0) {
        auVar124._8_8_ = 0;
        auVar124._0_8_ = plVar507[-0x2b];
        auVar370._8_8_ = 0;
        auVar370._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar541 + -0xa8);
        uVar503 = SUB168(auVar124 * auVar370,8);
        uVar531 = SUB168(auVar124 * auVar370,0);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      else {
        auVar156._8_8_ = 0;
        auVar156._0_8_ = plVar507[-0x2b];
        auVar402._8_8_ = 0;
        auVar402._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar541 + -0xa8);
        uVar531 = SUB168(auVar156 * auVar402,0);
        uVar503 = plVar507[-0x2a] * *(long *)((long)prVar1 + uVar501 * 8 + lVar541 + -0xa8) +
                  SUB168(auVar156 * auVar402,8);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      local_46f8 = local_46f8 + uVar531;
      local_4708 = local_4708 + (ulong)bVar550;
      if (plVar507[-0x28] == 0) {
        auVar125._8_8_ = 0;
        auVar125._0_8_ = plVar507[-0x29];
        auVar371._8_8_ = 0;
        auVar371._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar541 + -0xa0);
        uVar503 = SUB168(auVar125 * auVar371,8);
        uVar531 = SUB168(auVar125 * auVar371,0);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      else {
        auVar157._8_8_ = 0;
        auVar157._0_8_ = plVar507[-0x29];
        auVar403._8_8_ = 0;
        auVar403._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar541 + -0xa0);
        uVar531 = SUB168(auVar157 * auVar403,0);
        uVar503 = plVar507[-0x28] * *(long *)((long)prVar1 + uVar501 * 8 + lVar541 + -0xa0) +
                  SUB168(auVar157 * auVar403,8);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      local_46f8 = local_46f8 + uVar531;
      local_4708 = local_4708 + (ulong)bVar550;
      if (plVar507[-0x26] == 0) {
        auVar126._8_8_ = 0;
        auVar126._0_8_ = plVar507[-0x27];
        auVar372._8_8_ = 0;
        auVar372._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar541 + -0x98);
        uVar503 = SUB168(auVar126 * auVar372,8);
        uVar531 = SUB168(auVar126 * auVar372,0);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      else {
        auVar158._8_8_ = 0;
        auVar158._0_8_ = plVar507[-0x27];
        auVar404._8_8_ = 0;
        auVar404._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar541 + -0x98);
        uVar531 = SUB168(auVar158 * auVar404,0);
        uVar503 = plVar507[-0x26] * *(long *)((long)prVar1 + uVar501 * 8 + lVar541 + -0x98) +
                  SUB168(auVar158 * auVar404,8);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      local_46f8 = local_46f8 + uVar531;
      local_4708 = local_4708 + (ulong)bVar550;
      if (plVar507[-0x24] == 0) {
        auVar127._8_8_ = 0;
        auVar127._0_8_ = plVar507[-0x25];
        auVar373._8_8_ = 0;
        auVar373._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar541 + -0x90);
        uVar503 = SUB168(auVar127 * auVar373,8);
        uVar531 = SUB168(auVar127 * auVar373,0);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      else {
        auVar159._8_8_ = 0;
        auVar159._0_8_ = plVar507[-0x25];
        auVar405._8_8_ = 0;
        auVar405._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar541 + -0x90);
        uVar531 = SUB168(auVar159 * auVar405,0);
        uVar503 = plVar507[-0x24] * *(long *)((long)prVar1 + uVar501 * 8 + lVar541 + -0x90) +
                  SUB168(auVar159 * auVar405,8);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      local_46f8 = local_46f8 + uVar531;
      local_4708 = local_4708 + (ulong)bVar550;
      if (plVar507[-0x22] == 0) {
        auVar128._8_8_ = 0;
        auVar128._0_8_ = plVar507[-0x23];
        auVar374._8_8_ = 0;
        auVar374._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar541 + -0x88);
        uVar503 = SUB168(auVar128 * auVar374,8);
        uVar531 = SUB168(auVar128 * auVar374,0);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      else {
        auVar160._8_8_ = 0;
        auVar160._0_8_ = plVar507[-0x23];
        auVar406._8_8_ = 0;
        auVar406._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar541 + -0x88);
        uVar531 = SUB168(auVar160 * auVar406,0);
        uVar503 = plVar507[-0x22] * *(long *)((long)prVar1 + uVar501 * 8 + lVar541 + -0x88) +
                  SUB168(auVar160 * auVar406,8);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      local_46f8 = local_46f8 + uVar531;
      local_4708 = local_4708 + (ulong)bVar550;
      if (plVar507[-0x20] == 0) {
        auVar129._8_8_ = 0;
        auVar129._0_8_ = plVar507[-0x21];
        auVar375._8_8_ = 0;
        auVar375._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar541 + -0x80);
        uVar503 = SUB168(auVar129 * auVar375,8);
        uVar531 = SUB168(auVar129 * auVar375,0);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      else {
        auVar161._8_8_ = 0;
        auVar161._0_8_ = plVar507[-0x21];
        auVar407._8_8_ = 0;
        auVar407._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar541 + -0x80);
        uVar531 = SUB168(auVar161 * auVar407,0);
        uVar503 = plVar507[-0x20] * *(long *)((long)prVar1 + uVar501 * 8 + lVar541 + -0x80) +
                  SUB168(auVar161 * auVar407,8);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      local_46f8 = local_46f8 + uVar531;
      local_4708 = local_4708 + (ulong)bVar550;
      if (plVar507[-0x1e] == 0) {
        auVar130._8_8_ = 0;
        auVar130._0_8_ = plVar507[-0x1f];
        auVar376._8_8_ = 0;
        auVar376._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar541 + -0x78);
        uVar503 = SUB168(auVar130 * auVar376,8);
        uVar531 = SUB168(auVar130 * auVar376,0);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      else {
        auVar162._8_8_ = 0;
        auVar162._0_8_ = plVar507[-0x1f];
        auVar408._8_8_ = 0;
        auVar408._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar541 + -0x78);
        uVar531 = SUB168(auVar162 * auVar408,0);
        uVar503 = plVar507[-0x1e] * *(long *)((long)prVar1 + uVar501 * 8 + lVar541 + -0x78) +
                  SUB168(auVar162 * auVar408,8);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      local_46f8 = local_46f8 + uVar531;
      local_4708 = local_4708 + (ulong)bVar550;
      if (plVar507[-0x1c] == 0) {
        auVar131._8_8_ = 0;
        auVar131._0_8_ = plVar507[-0x1d];
        auVar377._8_8_ = 0;
        auVar377._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar541 + -0x70);
        uVar503 = SUB168(auVar131 * auVar377,8);
        uVar531 = SUB168(auVar131 * auVar377,0);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      else {
        auVar163._8_8_ = 0;
        auVar163._0_8_ = plVar507[-0x1d];
        auVar409._8_8_ = 0;
        auVar409._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar541 + -0x70);
        uVar531 = SUB168(auVar163 * auVar409,0);
        uVar503 = plVar507[-0x1c] * *(long *)((long)prVar1 + uVar501 * 8 + lVar541 + -0x70) +
                  SUB168(auVar163 * auVar409,8);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      local_46f8 = local_46f8 + uVar531;
      local_4708 = local_4708 + (ulong)bVar550;
      if (plVar507[-0x1a] == 0) {
        auVar132._8_8_ = 0;
        auVar132._0_8_ = plVar507[-0x1b];
        auVar378._8_8_ = 0;
        auVar378._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar541 + -0x68);
        uVar503 = SUB168(auVar132 * auVar378,8);
        uVar531 = SUB168(auVar132 * auVar378,0);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      else {
        auVar164._8_8_ = 0;
        auVar164._0_8_ = plVar507[-0x1b];
        auVar410._8_8_ = 0;
        auVar410._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar541 + -0x68);
        uVar531 = SUB168(auVar164 * auVar410,0);
        uVar503 = plVar507[-0x1a] * *(long *)((long)prVar1 + uVar501 * 8 + lVar541 + -0x68) +
                  SUB168(auVar164 * auVar410,8);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      local_46f8 = local_46f8 + uVar531;
      local_4708 = local_4708 + (ulong)bVar550;
      if (plVar507[-0x18] == 0) {
        auVar133._8_8_ = 0;
        auVar133._0_8_ = plVar507[-0x19];
        auVar379._8_8_ = 0;
        auVar379._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar501 * 8 + lVar541 + -0x80);
        uVar503 = SUB168(auVar133 * auVar379,8);
        uVar531 = SUB168(auVar133 * auVar379,0);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      else {
        auVar165._8_8_ = 0;
        auVar165._0_8_ = plVar507[-0x19];
        auVar411._8_8_ = 0;
        auVar411._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar501 * 8 + lVar541 + -0x80);
        uVar531 = SUB168(auVar165 * auVar411,0);
        uVar503 = plVar507[-0x18] *
                  *(long *)((long)prVar1->random_coeff + uVar501 * 8 + lVar541 + -0x80) +
                  SUB168(auVar165 * auVar411,8);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      local_46f8 = local_46f8 + uVar531;
      local_4708 = local_4708 + (ulong)bVar550;
      if (plVar507[-0x16] == 0) {
        auVar134._8_8_ = 0;
        auVar134._0_8_ = plVar507[-0x17];
        auVar380._8_8_ = 0;
        auVar380._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar501 * 8 + lVar541 + -0x78);
        uVar503 = SUB168(auVar134 * auVar380,8);
        uVar531 = SUB168(auVar134 * auVar380,0);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      else {
        auVar166._8_8_ = 0;
        auVar166._0_8_ = plVar507[-0x17];
        auVar412._8_8_ = 0;
        auVar412._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar501 * 8 + lVar541 + -0x78);
        uVar531 = SUB168(auVar166 * auVar412,0);
        uVar503 = plVar507[-0x16] *
                  *(long *)((long)prVar1->random_coeff + uVar501 * 8 + lVar541 + -0x78) +
                  SUB168(auVar166 * auVar412,8);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      local_46f8 = local_46f8 + uVar531;
      local_4708 = local_4708 + (ulong)bVar550;
      if (plVar507[-0x14] == 0) {
        auVar135._8_8_ = 0;
        auVar135._0_8_ = plVar507[-0x15];
        auVar381._8_8_ = 0;
        auVar381._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar501 * 8 + lVar541 + -0x70);
        uVar503 = SUB168(auVar135 * auVar381,8);
        uVar531 = SUB168(auVar135 * auVar381,0);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      else {
        auVar167._8_8_ = 0;
        auVar167._0_8_ = plVar507[-0x15];
        auVar413._8_8_ = 0;
        auVar413._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar501 * 8 + lVar541 + -0x70);
        uVar531 = SUB168(auVar167 * auVar413,0);
        uVar503 = plVar507[-0x14] *
                  *(long *)((long)prVar1->random_coeff + uVar501 * 8 + lVar541 + -0x70) +
                  SUB168(auVar167 * auVar413,8);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      local_46f8 = local_46f8 + uVar531;
      local_4708 = local_4708 + (ulong)bVar550;
      if (plVar507[-0x12] == 0) {
        auVar136._8_8_ = 0;
        auVar136._0_8_ = plVar507[-0x13];
        auVar382._8_8_ = 0;
        auVar382._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar501 * 8 + lVar541 + -0x68);
        uVar503 = SUB168(auVar136 * auVar382,8);
        uVar531 = SUB168(auVar136 * auVar382,0);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      else {
        auVar168._8_8_ = 0;
        auVar168._0_8_ = plVar507[-0x13];
        auVar414._8_8_ = 0;
        auVar414._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar501 * 8 + lVar541 + -0x68);
        uVar531 = SUB168(auVar168 * auVar414,0);
        uVar503 = plVar507[-0x12] *
                  *(long *)((long)prVar1->random_coeff + uVar501 * 8 + lVar541 + -0x68) +
                  SUB168(auVar168 * auVar414,8);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      local_46f8 = local_46f8 + uVar531;
      local_4708 = local_4708 + (ulong)bVar550;
      if (plVar507[-0x10] == 0) {
        auVar137._8_8_ = 0;
        auVar137._0_8_ = plVar507[-0x11];
        auVar383._8_8_ = 0;
        auVar383._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar501 * 8 + lVar541 + -0x60);
        uVar503 = SUB168(auVar137 * auVar383,8);
        uVar531 = SUB168(auVar137 * auVar383,0);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      else {
        auVar169._8_8_ = 0;
        auVar169._0_8_ = plVar507[-0x11];
        auVar415._8_8_ = 0;
        auVar415._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar501 * 8 + lVar541 + -0x60);
        uVar531 = SUB168(auVar169 * auVar415,0);
        uVar503 = plVar507[-0x10] *
                  *(long *)((long)prVar1->random_coeff + uVar501 * 8 + lVar541 + -0x60) +
                  SUB168(auVar169 * auVar415,8);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      local_46f8 = local_46f8 + uVar531;
      local_4708 = local_4708 + (ulong)bVar550;
      if (plVar507[-0xe] == 0) {
        auVar138._8_8_ = 0;
        auVar138._0_8_ = plVar507[-0xf];
        auVar384._8_8_ = 0;
        auVar384._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar501 * 8 + lVar541 + -0x58);
        uVar503 = SUB168(auVar138 * auVar384,8);
        uVar531 = SUB168(auVar138 * auVar384,0);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      else {
        auVar170._8_8_ = 0;
        auVar170._0_8_ = plVar507[-0xf];
        auVar416._8_8_ = 0;
        auVar416._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar501 * 8 + lVar541 + -0x58);
        uVar531 = SUB168(auVar170 * auVar416,0);
        uVar503 = plVar507[-0xe] *
                  *(long *)((long)prVar1->random_coeff + uVar501 * 8 + lVar541 + -0x58) +
                  SUB168(auVar170 * auVar416,8);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      local_46f8 = local_46f8 + uVar531;
      local_4708 = local_4708 + (ulong)bVar550;
      if (plVar507[-0xc] == 0) {
        auVar139._8_8_ = 0;
        auVar139._0_8_ = plVar507[-0xd];
        auVar385._8_8_ = 0;
        auVar385._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar501 * 8 + lVar541 + -0x50);
        uVar503 = SUB168(auVar139 * auVar385,8);
        uVar531 = SUB168(auVar139 * auVar385,0);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      else {
        auVar171._8_8_ = 0;
        auVar171._0_8_ = plVar507[-0xd];
        auVar417._8_8_ = 0;
        auVar417._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar501 * 8 + lVar541 + -0x50);
        uVar531 = SUB168(auVar171 * auVar417,0);
        uVar503 = plVar507[-0xc] *
                  *(long *)((long)prVar1->random_coeff + uVar501 * 8 + lVar541 + -0x50) +
                  SUB168(auVar171 * auVar417,8);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      local_46f8 = local_46f8 + uVar531;
      local_4708 = local_4708 + (ulong)bVar550;
      if (plVar507[-10] == 0) {
        auVar140._8_8_ = 0;
        auVar140._0_8_ = plVar507[-0xb];
        auVar386._8_8_ = 0;
        auVar386._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar501 * 8 + lVar541 + -0x48);
        uVar503 = SUB168(auVar140 * auVar386,8);
        uVar531 = SUB168(auVar140 * auVar386,0);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      else {
        auVar172._8_8_ = 0;
        auVar172._0_8_ = plVar507[-0xb];
        auVar418._8_8_ = 0;
        auVar418._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar501 * 8 + lVar541 + -0x48);
        uVar531 = SUB168(auVar172 * auVar418,0);
        uVar503 = plVar507[-10] *
                  *(long *)((long)prVar1->random_coeff + uVar501 * 8 + lVar541 + -0x48) +
                  SUB168(auVar172 * auVar418,8);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      local_46f8 = local_46f8 + uVar531;
      local_4708 = local_4708 + (ulong)bVar550;
      if (plVar507[-8] == 0) {
        auVar141._8_8_ = 0;
        auVar141._0_8_ = plVar507[-9];
        auVar387._8_8_ = 0;
        auVar387._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar501 * 8 + lVar541 + -0x40);
        uVar503 = SUB168(auVar141 * auVar387,8);
        uVar531 = SUB168(auVar141 * auVar387,0);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      else {
        auVar173._8_8_ = 0;
        auVar173._0_8_ = plVar507[-9];
        auVar419._8_8_ = 0;
        auVar419._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar501 * 8 + lVar541 + -0x40);
        uVar531 = SUB168(auVar173 * auVar419,0);
        uVar503 = plVar507[-8] *
                  *(long *)((long)prVar1->random_coeff + uVar501 * 8 + lVar541 + -0x40) +
                  SUB168(auVar173 * auVar419,8);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      local_46f8 = local_46f8 + uVar531;
      local_4708 = local_4708 + (ulong)bVar550;
      if (plVar507[-6] == 0) {
        auVar142._8_8_ = 0;
        auVar142._0_8_ = plVar507[-7];
        auVar388._8_8_ = 0;
        auVar388._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar501 * 8 + lVar541 + -0x38);
        uVar503 = SUB168(auVar142 * auVar388,8);
        uVar531 = SUB168(auVar142 * auVar388,0);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      else {
        auVar174._8_8_ = 0;
        auVar174._0_8_ = plVar507[-7];
        auVar420._8_8_ = 0;
        auVar420._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar501 * 8 + lVar541 + -0x38);
        uVar531 = SUB168(auVar174 * auVar420,0);
        uVar503 = plVar507[-6] *
                  *(long *)((long)prVar1->random_coeff + uVar501 * 8 + lVar541 + -0x38) +
                  SUB168(auVar174 * auVar420,8);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      local_46f8 = local_46f8 + uVar531;
      local_4708 = local_4708 + (ulong)bVar550;
      if (plVar507[-4] == 0) {
        auVar143._8_8_ = 0;
        auVar143._0_8_ = plVar507[-5];
        auVar389._8_8_ = 0;
        auVar389._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar501 * 8 + lVar541 + -0x30);
        uVar503 = SUB168(auVar143 * auVar389,8);
        uVar531 = SUB168(auVar143 * auVar389,0);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      else {
        auVar175._8_8_ = 0;
        auVar175._0_8_ = plVar507[-5];
        auVar421._8_8_ = 0;
        auVar421._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar501 * 8 + lVar541 + -0x30);
        uVar531 = SUB168(auVar175 * auVar421,0);
        uVar503 = plVar507[-4] *
                  *(long *)((long)prVar1->random_coeff + uVar501 * 8 + lVar541 + -0x30) +
                  SUB168(auVar175 * auVar421,8);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      local_46f8 = local_46f8 + uVar531;
      local_4708 = local_4708 + (ulong)bVar550;
      if (plVar507[-2] == 0) {
        auVar144._8_8_ = 0;
        auVar144._0_8_ = plVar507[-3];
        auVar390._8_8_ = 0;
        auVar390._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar501 * 8 + lVar541 + -0x28);
        uVar503 = SUB168(auVar144 * auVar390,8);
        uVar531 = SUB168(auVar144 * auVar390,0);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      else {
        auVar176._8_8_ = 0;
        auVar176._0_8_ = plVar507[-3];
        auVar422._8_8_ = 0;
        auVar422._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar501 * 8 + lVar541 + -0x28);
        uVar531 = SUB168(auVar176 * auVar422,0);
        uVar503 = plVar507[-2] *
                  *(long *)((long)prVar1->random_coeff + uVar501 * 8 + lVar541 + -0x28) +
                  SUB168(auVar176 * auVar422,8);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      local_46f8 = local_46f8 + uVar531;
      local_4708 = local_4708 + (ulong)bVar550;
      if (*plVar507 == 0) {
        auVar145._8_8_ = 0;
        auVar145._0_8_ = plVar507[-1];
        auVar391._8_8_ = 0;
        auVar391._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar501 * 8 + lVar541 + -0x20);
        uVar503 = SUB168(auVar145 * auVar391,8);
        uVar531 = SUB168(auVar145 * auVar391,0);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      else {
        auVar177._8_8_ = 0;
        auVar177._0_8_ = plVar507[-1];
        auVar423._8_8_ = 0;
        auVar423._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar501 * 8 + lVar541 + -0x20);
        uVar531 = SUB168(auVar177 * auVar423,0);
        uVar503 = *plVar507 * *(long *)((long)prVar1->random_coeff + uVar501 * 8 + lVar541 + -0x20)
                  + SUB168(auVar177 * auVar423,8);
        uVar500 = local_4700 + uVar503;
        bVar550 = CARRY8(local_4700,uVar503) || CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
        local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
      }
      local_46f8 = local_46f8 + uVar531;
      local_4708 = local_4708 + (ulong)bVar550;
      plVar507 = plVar507 + 0x40;
    }
    auVar178._8_8_ = 0;
    auVar178._0_8_ = local_4700;
    uVar500 = SUB168(auVar178 * ZEXT816(0xd),0);
    uVar501 = SUB168(auVar178 * ZEXT816(0xd),8) * 0xd + 0xd + local_4708 * 0xa9;
    uVar531 = uVar501 + local_46f8;
    uVar503 = uVar531 - uVar500;
    uVar501 = (((ulong)CARRY8(uVar501,local_46f8) + 1) - (ulong)(uVar531 < uVar500)) * -0xd +
              uVar503;
    if ((uVar503 < 0x1a) && (0x19 < uVar501)) {
      bVar550 = 0xfffffffffffffff2 < uVar501;
      uVar501 = uVar501 + 0xd;
      uVar500 = (ulong)bVar550;
    }
    else {
      uVar500 = 0;
    }
    uVar510 = 1 << ((uint)lVar535 & 0x1f);
    if ((uVar534 & uVar510) == 0) {
      auStack_4078[lVar535 + 1] = 0;
      uVar534 = uVar534 | uVar510;
    }
    lVar535 = lVar535 + 1;
    lVar541 = lVar541 + 0x420;
    iVar530 = iVar530 + 0x80;
  }
  lVar535 = 1;
  lVar541 = 0x440;
  iVar530 = 0x80;
  lVar519 = 0;
  do {
    uVar501 = auStack_4078[lVar535];
    uVar510 = 1 << ((uint)lVar535 & 0x1f);
    if ((uVar534 & uVar510) == 0) {
      if (uVar501 != 0) {
        if (uVar501 == 1) {
          lVar535 = (long)(int)((uint)lVar535 << 7);
          uVar501 = auStack_4038[lVar535 * 2];
          if (auStack_4038[lVar535 * 2 + 1] == 0) {
            uVar501 = (uVar501 >> 0x21 ^ uVar501) * -0x3b314601e57a13ad;
            uVar501 = uVar501 >> 0x21 ^ uVar501;
          }
          return uVar501;
        }
        auStack_4078[lVar535 + 1] = 0;
        uVar534 = uVar534 | uVar510;
        goto LAB_00181598;
      }
    }
    else if (uVar501 != 0) {
LAB_00181598:
      prVar1 = this->curr_rd;
      puVar529 = auStack_4038 + (long)iVar530 * 2;
      uVar500 = prVar1[lVar535].const_term;
      local_4700 = 0;
      local_4708 = 0;
      local_46f0 = 0;
      local_46e0 = 0;
      local_46f8 = uVar500;
      if (uVar501 < 0x40) {
        for (uVar531 = 0; uVar501 != uVar531; uVar531 = uVar531 + 1) {
          uVar503 = *(ulong *)((long)prVar1->random_coeff + uVar531 * 8 + lVar541 + -0x20);
          bVar550 = CARRY8(local_46f0,uVar503);
          local_46f0 = local_46f0 + uVar503;
          local_46e0 = local_46e0 + bVar550;
          if (puVar529[1] == 0) {
            auVar179._8_8_ = 0;
            auVar179._0_8_ = *puVar529;
            auVar424._8_8_ = 0;
            auVar424._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar531 * 8 + lVar541 + -0x20);
            uVar502 = SUB168(auVar179 * auVar424,8);
            uVar499 = SUB168(auVar179 * auVar424,0);
            uVar503 = local_4700 + uVar502;
            bVar550 = CARRY8(local_4700,uVar502) ||
                      CARRY8(uVar503,(ulong)CARRY8(local_46f8,uVar499));
            local_4700 = uVar503 + CARRY8(local_46f8,uVar499);
          }
          else {
            auVar180._8_8_ = 0;
            auVar180._0_8_ = *puVar529;
            auVar425._8_8_ = 0;
            auVar425._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar531 * 8 + lVar541 + -0x20);
            uVar499 = SUB168(auVar180 * auVar425,0);
            uVar502 = puVar529[1] *
                      *(long *)((long)prVar1->random_coeff + uVar531 * 8 + lVar541 + -0x20) +
                      SUB168(auVar180 * auVar425,8);
            uVar503 = local_4700 + uVar502;
            bVar550 = CARRY8(local_4700,uVar502) ||
                      CARRY8(uVar503,(ulong)CARRY8(local_46f8,uVar499));
            local_4700 = uVar503 + CARRY8(local_46f8,uVar499);
          }
          local_46f8 = local_46f8 + uVar499;
          local_4708 = local_4708 + (ulong)bVar550;
          puVar529 = puVar529 + 2;
        }
        bVar550 = local_46f0 <= prVar1[lVar535].cachedSumLow;
        local_46f0 = prVar1[lVar535].cachedSumLow - local_46f0;
        uVar501 = ~local_46e0;
        if (bVar550) {
          uVar501 = -local_46e0;
        }
        local_46e0 = prVar1[lVar535].cachedSumHigh + uVar501;
      }
      else {
        for (uVar531 = 0; uVar501 != uVar531; uVar531 = uVar531 + 1) {
          if (puVar529[1] == 0) {
            auVar181._8_8_ = 0;
            auVar181._0_8_ = *puVar529;
            auVar426._8_8_ = 0;
            auVar426._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar531 * 8 + lVar541 + -0x20);
            uVar502 = SUB168(auVar181 * auVar426,8);
            uVar499 = SUB168(auVar181 * auVar426,0);
            uVar503 = local_4700 + uVar502;
            bVar550 = CARRY8(local_4700,uVar502) ||
                      CARRY8(uVar503,(ulong)CARRY8(local_46f8,uVar499));
            local_4700 = uVar503 + CARRY8(local_46f8,uVar499);
          }
          else {
            auVar182._8_8_ = 0;
            auVar182._0_8_ = *puVar529;
            auVar427._8_8_ = 0;
            auVar427._0_8_ = *(ulong *)((long)prVar1->random_coeff + uVar531 * 8 + lVar541 + -0x20);
            uVar499 = SUB168(auVar182 * auVar427,0);
            uVar502 = puVar529[1] *
                      *(long *)((long)prVar1->random_coeff + uVar531 * 8 + lVar541 + -0x20) +
                      SUB168(auVar182 * auVar427,8);
            uVar503 = local_4700 + uVar502;
            bVar550 = CARRY8(local_4700,uVar502) ||
                      CARRY8(uVar503,(ulong)CARRY8(local_46f8,uVar499));
            local_4700 = uVar503 + CARRY8(local_46f8,uVar499);
          }
          local_46f8 = local_46f8 + uVar499;
          local_4708 = local_4708 + (ulong)bVar550;
          puVar529 = puVar529 + 2;
        }
        for (; uVar501 < 0x80; uVar501 = uVar501 + 1) {
          uVar531 = *(ulong *)((long)prVar1[1].random_coeff + uVar501 * 8 + lVar519);
          bVar550 = CARRY8(local_46f0,uVar531);
          local_46f0 = local_46f0 + uVar531;
          local_46e0 = local_46e0 + bVar550;
        }
      }
      auVar183._8_8_ = 0;
      auVar183._0_8_ = local_46f0;
      auVar428._8_8_ = 0;
      auVar428._0_8_ = uVar500;
      uVar503 = SUB168(auVar183 * auVar428,8);
      uVar501 = SUB168(auVar183 * auVar428,0);
      uVar499 = local_46f8 + uVar501;
      uVar501 = (ulong)CARRY8(local_46f8,uVar501);
      uVar531 = local_4700 + uVar503;
      auVar498._8_8_ = local_4708 + (ulong)(CARRY8(local_4700,uVar503) || CARRY8(uVar531,uVar501));
      auVar498._0_8_ = uVar531 + uVar501;
      auVar184._8_8_ = 0;
      auVar184._0_8_ = local_46e0;
      auVar429._8_8_ = 0;
      auVar429._0_8_ = uVar500;
      auVar498 = auVar184 * auVar429 + auVar498;
      auVar185._8_8_ = 0;
      auVar185._0_8_ = auVar498._0_8_;
      uVar500 = SUB168(auVar185 * ZEXT816(0xd),0);
      uVar501 = SUB168(auVar185 * ZEXT816(0xd),8) * 0xd + 0xd + auVar498._8_8_ * 0xa9;
      uVar531 = uVar501 + uVar499;
      uVar503 = uVar531 - uVar500;
      uVar501 = (((ulong)CARRY8(uVar501,uVar499) + 1) - (ulong)(uVar531 < uVar500)) * -0xd + uVar503
      ;
      lVar538 = lVar535;
      if (uVar503 < 0x1a) {
        if (uVar501 < 0x1a) {
          uVar500 = 0;
        }
        else {
          bVar550 = 0xfffffffffffffff2 < uVar501;
          uVar501 = uVar501 + 0xd;
          uVar500 = (ulong)bVar550;
        }
      }
      else {
        uVar500 = 0;
      }
      do {
        iVar540 = (int)lVar538 * 0x80;
        lVar532 = lVar538 * 0x420 + 0x538;
        do {
          lVar537 = lVar538;
          iVar540 = iVar540 + 0x80;
          uVar531 = auStack_4078[lVar537 + 1];
          lVar538 = lVar537 + 1;
          lVar533 = (long)((int)lVar538 << 7);
          auStack_4078[lVar537 + 1] = uVar531 + 1;
          auStack_4038[uVar531 * 2 + lVar533 * 2] = uVar501;
          auStack_4038[uVar531 * 2 + lVar533 * 2 + 1] = uVar500;
          if (uVar531 + 1 != 0x80) goto LAB_00183037;
          auStack_4078[lVar538] = 0;
          prVar1 = this->curr_rd;
          plVar507 = local_3e40 + (long)iVar540 * 2;
          local_46f8 = prVar1[lVar538].const_term;
          local_4700 = 0;
          local_4708 = 0;
          for (uVar501 = 0; uVar501 < 0x80; uVar501 = uVar501 + 0x20) {
            if (plVar507[-0x3e] == 0) {
              auVar186._8_8_ = 0;
              auVar186._0_8_ = plVar507[-0x3f];
              auVar430._8_8_ = 0;
              auVar430._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar532 + -0xf8);
              uVar503 = SUB168(auVar186 * auVar430,8);
              uVar531 = SUB168(auVar186 * auVar430,0);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            else {
              auVar218._8_8_ = 0;
              auVar218._0_8_ = plVar507[-0x3f];
              auVar462._8_8_ = 0;
              auVar462._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar532 + -0xf8);
              uVar531 = SUB168(auVar218 * auVar462,0);
              uVar503 = plVar507[-0x3e] * *(long *)((long)prVar1 + uVar501 * 8 + lVar532 + -0xf8) +
                        SUB168(auVar218 * auVar462,8);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            local_46f8 = local_46f8 + uVar531;
            local_4708 = local_4708 + (ulong)bVar550;
            if (plVar507[-0x3c] == 0) {
              auVar187._8_8_ = 0;
              auVar187._0_8_ = plVar507[-0x3d];
              auVar431._8_8_ = 0;
              auVar431._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar532 + -0xf0);
              uVar503 = SUB168(auVar187 * auVar431,8);
              uVar531 = SUB168(auVar187 * auVar431,0);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            else {
              auVar219._8_8_ = 0;
              auVar219._0_8_ = plVar507[-0x3d];
              auVar463._8_8_ = 0;
              auVar463._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar532 + -0xf0);
              uVar531 = SUB168(auVar219 * auVar463,0);
              uVar503 = plVar507[-0x3c] * *(long *)((long)prVar1 + uVar501 * 8 + lVar532 + -0xf0) +
                        SUB168(auVar219 * auVar463,8);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            local_46f8 = local_46f8 + uVar531;
            local_4708 = local_4708 + (ulong)bVar550;
            if (plVar507[-0x3a] == 0) {
              auVar188._8_8_ = 0;
              auVar188._0_8_ = plVar507[-0x3b];
              auVar432._8_8_ = 0;
              auVar432._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar532 + -0xe8);
              uVar503 = SUB168(auVar188 * auVar432,8);
              uVar531 = SUB168(auVar188 * auVar432,0);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            else {
              auVar220._8_8_ = 0;
              auVar220._0_8_ = plVar507[-0x3b];
              auVar464._8_8_ = 0;
              auVar464._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar532 + -0xe8);
              uVar531 = SUB168(auVar220 * auVar464,0);
              uVar503 = plVar507[-0x3a] * *(long *)((long)prVar1 + uVar501 * 8 + lVar532 + -0xe8) +
                        SUB168(auVar220 * auVar464,8);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            local_46f8 = local_46f8 + uVar531;
            local_4708 = local_4708 + (ulong)bVar550;
            if (plVar507[-0x38] == 0) {
              auVar189._8_8_ = 0;
              auVar189._0_8_ = plVar507[-0x39];
              auVar433._8_8_ = 0;
              auVar433._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar532 + -0xe0);
              uVar503 = SUB168(auVar189 * auVar433,8);
              uVar531 = SUB168(auVar189 * auVar433,0);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            else {
              auVar221._8_8_ = 0;
              auVar221._0_8_ = plVar507[-0x39];
              auVar465._8_8_ = 0;
              auVar465._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar532 + -0xe0);
              uVar531 = SUB168(auVar221 * auVar465,0);
              uVar503 = plVar507[-0x38] * *(long *)((long)prVar1 + uVar501 * 8 + lVar532 + -0xe0) +
                        SUB168(auVar221 * auVar465,8);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            local_46f8 = local_46f8 + uVar531;
            local_4708 = local_4708 + (ulong)bVar550;
            if (plVar507[-0x36] == 0) {
              auVar190._8_8_ = 0;
              auVar190._0_8_ = plVar507[-0x37];
              auVar434._8_8_ = 0;
              auVar434._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar532 + -0xd8);
              uVar503 = SUB168(auVar190 * auVar434,8);
              uVar531 = SUB168(auVar190 * auVar434,0);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            else {
              auVar222._8_8_ = 0;
              auVar222._0_8_ = plVar507[-0x37];
              auVar466._8_8_ = 0;
              auVar466._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar532 + -0xd8);
              uVar531 = SUB168(auVar222 * auVar466,0);
              uVar503 = plVar507[-0x36] * *(long *)((long)prVar1 + uVar501 * 8 + lVar532 + -0xd8) +
                        SUB168(auVar222 * auVar466,8);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            local_46f8 = local_46f8 + uVar531;
            local_4708 = local_4708 + (ulong)bVar550;
            if (plVar507[-0x34] == 0) {
              auVar191._8_8_ = 0;
              auVar191._0_8_ = plVar507[-0x35];
              auVar435._8_8_ = 0;
              auVar435._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar532 + -0xd0);
              uVar503 = SUB168(auVar191 * auVar435,8);
              uVar531 = SUB168(auVar191 * auVar435,0);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            else {
              auVar223._8_8_ = 0;
              auVar223._0_8_ = plVar507[-0x35];
              auVar467._8_8_ = 0;
              auVar467._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar532 + -0xd0);
              uVar531 = SUB168(auVar223 * auVar467,0);
              uVar503 = plVar507[-0x34] * *(long *)((long)prVar1 + uVar501 * 8 + lVar532 + -0xd0) +
                        SUB168(auVar223 * auVar467,8);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            local_46f8 = local_46f8 + uVar531;
            local_4708 = local_4708 + (ulong)bVar550;
            if (plVar507[-0x32] == 0) {
              auVar192._8_8_ = 0;
              auVar192._0_8_ = plVar507[-0x33];
              auVar436._8_8_ = 0;
              auVar436._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar532 + -200);
              uVar503 = SUB168(auVar192 * auVar436,8);
              uVar531 = SUB168(auVar192 * auVar436,0);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            else {
              auVar224._8_8_ = 0;
              auVar224._0_8_ = plVar507[-0x33];
              auVar468._8_8_ = 0;
              auVar468._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar532 + -200);
              uVar531 = SUB168(auVar224 * auVar468,0);
              uVar503 = plVar507[-0x32] * *(long *)((long)prVar1 + uVar501 * 8 + lVar532 + -200) +
                        SUB168(auVar224 * auVar468,8);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            local_46f8 = local_46f8 + uVar531;
            local_4708 = local_4708 + (ulong)bVar550;
            if (plVar507[-0x30] == 0) {
              auVar193._8_8_ = 0;
              auVar193._0_8_ = plVar507[-0x31];
              auVar437._8_8_ = 0;
              auVar437._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar532 + -0xc0);
              uVar503 = SUB168(auVar193 * auVar437,8);
              uVar531 = SUB168(auVar193 * auVar437,0);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            else {
              auVar225._8_8_ = 0;
              auVar225._0_8_ = plVar507[-0x31];
              auVar469._8_8_ = 0;
              auVar469._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar532 + -0xc0);
              uVar531 = SUB168(auVar225 * auVar469,0);
              uVar503 = plVar507[-0x30] * *(long *)((long)prVar1 + uVar501 * 8 + lVar532 + -0xc0) +
                        SUB168(auVar225 * auVar469,8);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            local_46f8 = local_46f8 + uVar531;
            local_4708 = local_4708 + (ulong)bVar550;
            if (plVar507[-0x2e] == 0) {
              auVar194._8_8_ = 0;
              auVar194._0_8_ = plVar507[-0x2f];
              auVar438._8_8_ = 0;
              auVar438._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar532 + -0xb8);
              uVar503 = SUB168(auVar194 * auVar438,8);
              uVar531 = SUB168(auVar194 * auVar438,0);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            else {
              auVar226._8_8_ = 0;
              auVar226._0_8_ = plVar507[-0x2f];
              auVar470._8_8_ = 0;
              auVar470._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar532 + -0xb8);
              uVar531 = SUB168(auVar226 * auVar470,0);
              uVar503 = plVar507[-0x2e] * *(long *)((long)prVar1 + uVar501 * 8 + lVar532 + -0xb8) +
                        SUB168(auVar226 * auVar470,8);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            local_46f8 = local_46f8 + uVar531;
            local_4708 = local_4708 + (ulong)bVar550;
            if (plVar507[-0x2c] == 0) {
              auVar195._8_8_ = 0;
              auVar195._0_8_ = plVar507[-0x2d];
              auVar439._8_8_ = 0;
              auVar439._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar532 + -0xb0);
              uVar503 = SUB168(auVar195 * auVar439,8);
              uVar531 = SUB168(auVar195 * auVar439,0);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            else {
              auVar227._8_8_ = 0;
              auVar227._0_8_ = plVar507[-0x2d];
              auVar471._8_8_ = 0;
              auVar471._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar532 + -0xb0);
              uVar531 = SUB168(auVar227 * auVar471,0);
              uVar503 = plVar507[-0x2c] * *(long *)((long)prVar1 + uVar501 * 8 + lVar532 + -0xb0) +
                        SUB168(auVar227 * auVar471,8);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            local_46f8 = local_46f8 + uVar531;
            local_4708 = local_4708 + (ulong)bVar550;
            if (plVar507[-0x2a] == 0) {
              auVar196._8_8_ = 0;
              auVar196._0_8_ = plVar507[-0x2b];
              auVar440._8_8_ = 0;
              auVar440._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar532 + -0xa8);
              uVar503 = SUB168(auVar196 * auVar440,8);
              uVar531 = SUB168(auVar196 * auVar440,0);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            else {
              auVar228._8_8_ = 0;
              auVar228._0_8_ = plVar507[-0x2b];
              auVar472._8_8_ = 0;
              auVar472._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar532 + -0xa8);
              uVar531 = SUB168(auVar228 * auVar472,0);
              uVar503 = plVar507[-0x2a] * *(long *)((long)prVar1 + uVar501 * 8 + lVar532 + -0xa8) +
                        SUB168(auVar228 * auVar472,8);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            local_46f8 = local_46f8 + uVar531;
            local_4708 = local_4708 + (ulong)bVar550;
            if (plVar507[-0x28] == 0) {
              auVar197._8_8_ = 0;
              auVar197._0_8_ = plVar507[-0x29];
              auVar441._8_8_ = 0;
              auVar441._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar532 + -0xa0);
              uVar503 = SUB168(auVar197 * auVar441,8);
              uVar531 = SUB168(auVar197 * auVar441,0);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            else {
              auVar229._8_8_ = 0;
              auVar229._0_8_ = plVar507[-0x29];
              auVar473._8_8_ = 0;
              auVar473._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar532 + -0xa0);
              uVar531 = SUB168(auVar229 * auVar473,0);
              uVar503 = plVar507[-0x28] * *(long *)((long)prVar1 + uVar501 * 8 + lVar532 + -0xa0) +
                        SUB168(auVar229 * auVar473,8);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            local_46f8 = local_46f8 + uVar531;
            local_4708 = local_4708 + (ulong)bVar550;
            if (plVar507[-0x26] == 0) {
              auVar198._8_8_ = 0;
              auVar198._0_8_ = plVar507[-0x27];
              auVar442._8_8_ = 0;
              auVar442._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar532 + -0x98);
              uVar503 = SUB168(auVar198 * auVar442,8);
              uVar531 = SUB168(auVar198 * auVar442,0);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            else {
              auVar230._8_8_ = 0;
              auVar230._0_8_ = plVar507[-0x27];
              auVar474._8_8_ = 0;
              auVar474._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar532 + -0x98);
              uVar531 = SUB168(auVar230 * auVar474,0);
              uVar503 = plVar507[-0x26] * *(long *)((long)prVar1 + uVar501 * 8 + lVar532 + -0x98) +
                        SUB168(auVar230 * auVar474,8);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            local_46f8 = local_46f8 + uVar531;
            local_4708 = local_4708 + (ulong)bVar550;
            if (plVar507[-0x24] == 0) {
              auVar199._8_8_ = 0;
              auVar199._0_8_ = plVar507[-0x25];
              auVar443._8_8_ = 0;
              auVar443._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar532 + -0x90);
              uVar503 = SUB168(auVar199 * auVar443,8);
              uVar531 = SUB168(auVar199 * auVar443,0);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            else {
              auVar231._8_8_ = 0;
              auVar231._0_8_ = plVar507[-0x25];
              auVar475._8_8_ = 0;
              auVar475._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar532 + -0x90);
              uVar531 = SUB168(auVar231 * auVar475,0);
              uVar503 = plVar507[-0x24] * *(long *)((long)prVar1 + uVar501 * 8 + lVar532 + -0x90) +
                        SUB168(auVar231 * auVar475,8);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            local_46f8 = local_46f8 + uVar531;
            local_4708 = local_4708 + (ulong)bVar550;
            if (plVar507[-0x22] == 0) {
              auVar200._8_8_ = 0;
              auVar200._0_8_ = plVar507[-0x23];
              auVar444._8_8_ = 0;
              auVar444._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar532 + -0x88);
              uVar503 = SUB168(auVar200 * auVar444,8);
              uVar531 = SUB168(auVar200 * auVar444,0);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            else {
              auVar232._8_8_ = 0;
              auVar232._0_8_ = plVar507[-0x23];
              auVar476._8_8_ = 0;
              auVar476._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar532 + -0x88);
              uVar531 = SUB168(auVar232 * auVar476,0);
              uVar503 = plVar507[-0x22] * *(long *)((long)prVar1 + uVar501 * 8 + lVar532 + -0x88) +
                        SUB168(auVar232 * auVar476,8);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            local_46f8 = local_46f8 + uVar531;
            local_4708 = local_4708 + (ulong)bVar550;
            if (plVar507[-0x20] == 0) {
              auVar201._8_8_ = 0;
              auVar201._0_8_ = plVar507[-0x21];
              auVar445._8_8_ = 0;
              auVar445._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar532 + -0x80);
              uVar503 = SUB168(auVar201 * auVar445,8);
              uVar531 = SUB168(auVar201 * auVar445,0);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            else {
              auVar233._8_8_ = 0;
              auVar233._0_8_ = plVar507[-0x21];
              auVar477._8_8_ = 0;
              auVar477._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar532 + -0x80);
              uVar531 = SUB168(auVar233 * auVar477,0);
              uVar503 = plVar507[-0x20] * *(long *)((long)prVar1 + uVar501 * 8 + lVar532 + -0x80) +
                        SUB168(auVar233 * auVar477,8);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            local_46f8 = local_46f8 + uVar531;
            local_4708 = local_4708 + (ulong)bVar550;
            if (plVar507[-0x1e] == 0) {
              auVar202._8_8_ = 0;
              auVar202._0_8_ = plVar507[-0x1f];
              auVar446._8_8_ = 0;
              auVar446._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar532 + -0x78);
              uVar503 = SUB168(auVar202 * auVar446,8);
              uVar531 = SUB168(auVar202 * auVar446,0);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            else {
              auVar234._8_8_ = 0;
              auVar234._0_8_ = plVar507[-0x1f];
              auVar478._8_8_ = 0;
              auVar478._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar532 + -0x78);
              uVar531 = SUB168(auVar234 * auVar478,0);
              uVar503 = plVar507[-0x1e] * *(long *)((long)prVar1 + uVar501 * 8 + lVar532 + -0x78) +
                        SUB168(auVar234 * auVar478,8);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            local_46f8 = local_46f8 + uVar531;
            local_4708 = local_4708 + (ulong)bVar550;
            if (plVar507[-0x1c] == 0) {
              auVar203._8_8_ = 0;
              auVar203._0_8_ = plVar507[-0x1d];
              auVar447._8_8_ = 0;
              auVar447._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar532 + -0x70);
              uVar503 = SUB168(auVar203 * auVar447,8);
              uVar531 = SUB168(auVar203 * auVar447,0);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            else {
              auVar235._8_8_ = 0;
              auVar235._0_8_ = plVar507[-0x1d];
              auVar479._8_8_ = 0;
              auVar479._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar532 + -0x70);
              uVar531 = SUB168(auVar235 * auVar479,0);
              uVar503 = plVar507[-0x1c] * *(long *)((long)prVar1 + uVar501 * 8 + lVar532 + -0x70) +
                        SUB168(auVar235 * auVar479,8);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            local_46f8 = local_46f8 + uVar531;
            local_4708 = local_4708 + (ulong)bVar550;
            if (plVar507[-0x1a] == 0) {
              auVar204._8_8_ = 0;
              auVar204._0_8_ = plVar507[-0x1b];
              auVar448._8_8_ = 0;
              auVar448._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar532 + -0x68);
              uVar503 = SUB168(auVar204 * auVar448,8);
              uVar531 = SUB168(auVar204 * auVar448,0);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            else {
              auVar236._8_8_ = 0;
              auVar236._0_8_ = plVar507[-0x1b];
              auVar480._8_8_ = 0;
              auVar480._0_8_ = *(ulong *)((long)prVar1 + uVar501 * 8 + lVar532 + -0x68);
              uVar531 = SUB168(auVar236 * auVar480,0);
              uVar503 = plVar507[-0x1a] * *(long *)((long)prVar1 + uVar501 * 8 + lVar532 + -0x68) +
                        SUB168(auVar236 * auVar480,8);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            local_46f8 = local_46f8 + uVar531;
            local_4708 = local_4708 + (ulong)bVar550;
            if (plVar507[-0x18] == 0) {
              auVar205._8_8_ = 0;
              auVar205._0_8_ = plVar507[-0x19];
              auVar449._8_8_ = 0;
              auVar449._0_8_ =
                   *(ulong *)((long)prVar1->random_coeff + uVar501 * 8 + lVar532 + -0x80);
              uVar503 = SUB168(auVar205 * auVar449,8);
              uVar531 = SUB168(auVar205 * auVar449,0);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            else {
              auVar237._8_8_ = 0;
              auVar237._0_8_ = plVar507[-0x19];
              auVar481._8_8_ = 0;
              auVar481._0_8_ =
                   *(ulong *)((long)prVar1->random_coeff + uVar501 * 8 + lVar532 + -0x80);
              uVar531 = SUB168(auVar237 * auVar481,0);
              uVar503 = plVar507[-0x18] *
                        *(long *)((long)prVar1->random_coeff + uVar501 * 8 + lVar532 + -0x80) +
                        SUB168(auVar237 * auVar481,8);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            local_46f8 = local_46f8 + uVar531;
            local_4708 = local_4708 + (ulong)bVar550;
            if (plVar507[-0x16] == 0) {
              auVar206._8_8_ = 0;
              auVar206._0_8_ = plVar507[-0x17];
              auVar450._8_8_ = 0;
              auVar450._0_8_ =
                   *(ulong *)((long)prVar1->random_coeff + uVar501 * 8 + lVar532 + -0x78);
              uVar503 = SUB168(auVar206 * auVar450,8);
              uVar531 = SUB168(auVar206 * auVar450,0);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            else {
              auVar238._8_8_ = 0;
              auVar238._0_8_ = plVar507[-0x17];
              auVar482._8_8_ = 0;
              auVar482._0_8_ =
                   *(ulong *)((long)prVar1->random_coeff + uVar501 * 8 + lVar532 + -0x78);
              uVar531 = SUB168(auVar238 * auVar482,0);
              uVar503 = plVar507[-0x16] *
                        *(long *)((long)prVar1->random_coeff + uVar501 * 8 + lVar532 + -0x78) +
                        SUB168(auVar238 * auVar482,8);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            local_46f8 = local_46f8 + uVar531;
            local_4708 = local_4708 + (ulong)bVar550;
            if (plVar507[-0x14] == 0) {
              auVar207._8_8_ = 0;
              auVar207._0_8_ = plVar507[-0x15];
              auVar451._8_8_ = 0;
              auVar451._0_8_ =
                   *(ulong *)((long)prVar1->random_coeff + uVar501 * 8 + lVar532 + -0x70);
              uVar503 = SUB168(auVar207 * auVar451,8);
              uVar531 = SUB168(auVar207 * auVar451,0);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            else {
              auVar239._8_8_ = 0;
              auVar239._0_8_ = plVar507[-0x15];
              auVar483._8_8_ = 0;
              auVar483._0_8_ =
                   *(ulong *)((long)prVar1->random_coeff + uVar501 * 8 + lVar532 + -0x70);
              uVar531 = SUB168(auVar239 * auVar483,0);
              uVar503 = plVar507[-0x14] *
                        *(long *)((long)prVar1->random_coeff + uVar501 * 8 + lVar532 + -0x70) +
                        SUB168(auVar239 * auVar483,8);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            local_46f8 = local_46f8 + uVar531;
            local_4708 = local_4708 + (ulong)bVar550;
            if (plVar507[-0x12] == 0) {
              auVar208._8_8_ = 0;
              auVar208._0_8_ = plVar507[-0x13];
              auVar452._8_8_ = 0;
              auVar452._0_8_ =
                   *(ulong *)((long)prVar1->random_coeff + uVar501 * 8 + lVar532 + -0x68);
              uVar503 = SUB168(auVar208 * auVar452,8);
              uVar531 = SUB168(auVar208 * auVar452,0);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            else {
              auVar240._8_8_ = 0;
              auVar240._0_8_ = plVar507[-0x13];
              auVar484._8_8_ = 0;
              auVar484._0_8_ =
                   *(ulong *)((long)prVar1->random_coeff + uVar501 * 8 + lVar532 + -0x68);
              uVar531 = SUB168(auVar240 * auVar484,0);
              uVar503 = plVar507[-0x12] *
                        *(long *)((long)prVar1->random_coeff + uVar501 * 8 + lVar532 + -0x68) +
                        SUB168(auVar240 * auVar484,8);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            local_46f8 = local_46f8 + uVar531;
            local_4708 = local_4708 + (ulong)bVar550;
            if (plVar507[-0x10] == 0) {
              auVar209._8_8_ = 0;
              auVar209._0_8_ = plVar507[-0x11];
              auVar453._8_8_ = 0;
              auVar453._0_8_ =
                   *(ulong *)((long)prVar1->random_coeff + uVar501 * 8 + lVar532 + -0x60);
              uVar503 = SUB168(auVar209 * auVar453,8);
              uVar531 = SUB168(auVar209 * auVar453,0);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            else {
              auVar241._8_8_ = 0;
              auVar241._0_8_ = plVar507[-0x11];
              auVar485._8_8_ = 0;
              auVar485._0_8_ =
                   *(ulong *)((long)prVar1->random_coeff + uVar501 * 8 + lVar532 + -0x60);
              uVar531 = SUB168(auVar241 * auVar485,0);
              uVar503 = plVar507[-0x10] *
                        *(long *)((long)prVar1->random_coeff + uVar501 * 8 + lVar532 + -0x60) +
                        SUB168(auVar241 * auVar485,8);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            local_46f8 = local_46f8 + uVar531;
            local_4708 = local_4708 + (ulong)bVar550;
            if (plVar507[-0xe] == 0) {
              auVar210._8_8_ = 0;
              auVar210._0_8_ = plVar507[-0xf];
              auVar454._8_8_ = 0;
              auVar454._0_8_ =
                   *(ulong *)((long)prVar1->random_coeff + uVar501 * 8 + lVar532 + -0x58);
              uVar503 = SUB168(auVar210 * auVar454,8);
              uVar531 = SUB168(auVar210 * auVar454,0);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            else {
              auVar242._8_8_ = 0;
              auVar242._0_8_ = plVar507[-0xf];
              auVar486._8_8_ = 0;
              auVar486._0_8_ =
                   *(ulong *)((long)prVar1->random_coeff + uVar501 * 8 + lVar532 + -0x58);
              uVar531 = SUB168(auVar242 * auVar486,0);
              uVar503 = plVar507[-0xe] *
                        *(long *)((long)prVar1->random_coeff + uVar501 * 8 + lVar532 + -0x58) +
                        SUB168(auVar242 * auVar486,8);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            local_46f8 = local_46f8 + uVar531;
            local_4708 = local_4708 + (ulong)bVar550;
            if (plVar507[-0xc] == 0) {
              auVar211._8_8_ = 0;
              auVar211._0_8_ = plVar507[-0xd];
              auVar455._8_8_ = 0;
              auVar455._0_8_ =
                   *(ulong *)((long)prVar1->random_coeff + uVar501 * 8 + lVar532 + -0x50);
              uVar503 = SUB168(auVar211 * auVar455,8);
              uVar531 = SUB168(auVar211 * auVar455,0);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            else {
              auVar243._8_8_ = 0;
              auVar243._0_8_ = plVar507[-0xd];
              auVar487._8_8_ = 0;
              auVar487._0_8_ =
                   *(ulong *)((long)prVar1->random_coeff + uVar501 * 8 + lVar532 + -0x50);
              uVar531 = SUB168(auVar243 * auVar487,0);
              uVar503 = plVar507[-0xc] *
                        *(long *)((long)prVar1->random_coeff + uVar501 * 8 + lVar532 + -0x50) +
                        SUB168(auVar243 * auVar487,8);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            local_46f8 = local_46f8 + uVar531;
            local_4708 = local_4708 + (ulong)bVar550;
            if (plVar507[-10] == 0) {
              auVar212._8_8_ = 0;
              auVar212._0_8_ = plVar507[-0xb];
              auVar456._8_8_ = 0;
              auVar456._0_8_ =
                   *(ulong *)((long)prVar1->random_coeff + uVar501 * 8 + lVar532 + -0x48);
              uVar503 = SUB168(auVar212 * auVar456,8);
              uVar531 = SUB168(auVar212 * auVar456,0);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            else {
              auVar244._8_8_ = 0;
              auVar244._0_8_ = plVar507[-0xb];
              auVar488._8_8_ = 0;
              auVar488._0_8_ =
                   *(ulong *)((long)prVar1->random_coeff + uVar501 * 8 + lVar532 + -0x48);
              uVar531 = SUB168(auVar244 * auVar488,0);
              uVar503 = plVar507[-10] *
                        *(long *)((long)prVar1->random_coeff + uVar501 * 8 + lVar532 + -0x48) +
                        SUB168(auVar244 * auVar488,8);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            local_46f8 = local_46f8 + uVar531;
            local_4708 = local_4708 + (ulong)bVar550;
            if (plVar507[-8] == 0) {
              auVar213._8_8_ = 0;
              auVar213._0_8_ = plVar507[-9];
              auVar457._8_8_ = 0;
              auVar457._0_8_ =
                   *(ulong *)((long)prVar1->random_coeff + uVar501 * 8 + lVar532 + -0x40);
              uVar503 = SUB168(auVar213 * auVar457,8);
              uVar531 = SUB168(auVar213 * auVar457,0);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            else {
              auVar245._8_8_ = 0;
              auVar245._0_8_ = plVar507[-9];
              auVar489._8_8_ = 0;
              auVar489._0_8_ =
                   *(ulong *)((long)prVar1->random_coeff + uVar501 * 8 + lVar532 + -0x40);
              uVar531 = SUB168(auVar245 * auVar489,0);
              uVar503 = plVar507[-8] *
                        *(long *)((long)prVar1->random_coeff + uVar501 * 8 + lVar532 + -0x40) +
                        SUB168(auVar245 * auVar489,8);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            local_46f8 = local_46f8 + uVar531;
            local_4708 = local_4708 + (ulong)bVar550;
            if (plVar507[-6] == 0) {
              auVar214._8_8_ = 0;
              auVar214._0_8_ = plVar507[-7];
              auVar458._8_8_ = 0;
              auVar458._0_8_ =
                   *(ulong *)((long)prVar1->random_coeff + uVar501 * 8 + lVar532 + -0x38);
              uVar503 = SUB168(auVar214 * auVar458,8);
              uVar531 = SUB168(auVar214 * auVar458,0);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            else {
              auVar246._8_8_ = 0;
              auVar246._0_8_ = plVar507[-7];
              auVar490._8_8_ = 0;
              auVar490._0_8_ =
                   *(ulong *)((long)prVar1->random_coeff + uVar501 * 8 + lVar532 + -0x38);
              uVar531 = SUB168(auVar246 * auVar490,0);
              uVar503 = plVar507[-6] *
                        *(long *)((long)prVar1->random_coeff + uVar501 * 8 + lVar532 + -0x38) +
                        SUB168(auVar246 * auVar490,8);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            local_46f8 = local_46f8 + uVar531;
            local_4708 = local_4708 + (ulong)bVar550;
            if (plVar507[-4] == 0) {
              auVar215._8_8_ = 0;
              auVar215._0_8_ = plVar507[-5];
              auVar459._8_8_ = 0;
              auVar459._0_8_ =
                   *(ulong *)((long)prVar1->random_coeff + uVar501 * 8 + lVar532 + -0x30);
              uVar503 = SUB168(auVar215 * auVar459,8);
              uVar531 = SUB168(auVar215 * auVar459,0);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            else {
              auVar247._8_8_ = 0;
              auVar247._0_8_ = plVar507[-5];
              auVar491._8_8_ = 0;
              auVar491._0_8_ =
                   *(ulong *)((long)prVar1->random_coeff + uVar501 * 8 + lVar532 + -0x30);
              uVar531 = SUB168(auVar247 * auVar491,0);
              uVar503 = plVar507[-4] *
                        *(long *)((long)prVar1->random_coeff + uVar501 * 8 + lVar532 + -0x30) +
                        SUB168(auVar247 * auVar491,8);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            local_46f8 = local_46f8 + uVar531;
            local_4708 = local_4708 + (ulong)bVar550;
            if (plVar507[-2] == 0) {
              auVar216._8_8_ = 0;
              auVar216._0_8_ = plVar507[-3];
              auVar460._8_8_ = 0;
              auVar460._0_8_ =
                   *(ulong *)((long)prVar1->random_coeff + uVar501 * 8 + lVar532 + -0x28);
              uVar503 = SUB168(auVar216 * auVar460,8);
              uVar531 = SUB168(auVar216 * auVar460,0);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            else {
              auVar248._8_8_ = 0;
              auVar248._0_8_ = plVar507[-3];
              auVar492._8_8_ = 0;
              auVar492._0_8_ =
                   *(ulong *)((long)prVar1->random_coeff + uVar501 * 8 + lVar532 + -0x28);
              uVar531 = SUB168(auVar248 * auVar492,0);
              uVar503 = plVar507[-2] *
                        *(long *)((long)prVar1->random_coeff + uVar501 * 8 + lVar532 + -0x28) +
                        SUB168(auVar248 * auVar492,8);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            local_46f8 = local_46f8 + uVar531;
            local_4708 = local_4708 + (ulong)bVar550;
            if (*plVar507 == 0) {
              auVar217._8_8_ = 0;
              auVar217._0_8_ = plVar507[-1];
              auVar461._8_8_ = 0;
              auVar461._0_8_ =
                   *(ulong *)((long)prVar1->random_coeff + uVar501 * 8 + lVar532 + -0x20);
              uVar503 = SUB168(auVar217 * auVar461,8);
              uVar531 = SUB168(auVar217 * auVar461,0);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            else {
              auVar249._8_8_ = 0;
              auVar249._0_8_ = plVar507[-1];
              auVar493._8_8_ = 0;
              auVar493._0_8_ =
                   *(ulong *)((long)prVar1->random_coeff + uVar501 * 8 + lVar532 + -0x20);
              uVar531 = SUB168(auVar249 * auVar493,0);
              uVar503 = *plVar507 *
                        *(long *)((long)prVar1->random_coeff + uVar501 * 8 + lVar532 + -0x20) +
                        SUB168(auVar249 * auVar493,8);
              uVar500 = local_4700 + uVar503;
              bVar550 = CARRY8(local_4700,uVar503) ||
                        CARRY8(uVar500,(ulong)CARRY8(local_46f8,uVar531));
              local_4700 = uVar500 + CARRY8(local_46f8,uVar531);
            }
            local_46f8 = local_46f8 + uVar531;
            local_4708 = local_4708 + (ulong)bVar550;
            plVar507 = plVar507 + 0x40;
          }
          auVar250._8_8_ = 0;
          auVar250._0_8_ = local_4700;
          uVar500 = SUB168(auVar250 * ZEXT816(0xd),0);
          uVar501 = SUB168(auVar250 * ZEXT816(0xd),8) * 0xd + 0xd + local_4708 * 0xa9;
          uVar531 = uVar501 + local_46f8;
          uVar503 = uVar531 - uVar500;
          uVar501 = (((ulong)CARRY8(uVar501,local_46f8) + 1) - (ulong)(uVar531 < uVar500)) * -0xd +
                    uVar503;
          if ((uVar503 < 0x1a) && (0x19 < uVar501)) {
            bVar550 = 0xfffffffffffffff2 < uVar501;
            uVar501 = uVar501 + 0xd;
            uVar500 = (ulong)bVar550;
          }
          else {
            uVar500 = 0;
          }
          uVar510 = 2 << ((uint)lVar537 & 0x1f);
          lVar532 = lVar532 + 0x420;
        } while ((uVar534 & uVar510) != 0);
        auStack_4078[lVar537 + 2] = 0;
        uVar534 = uVar534 | uVar510;
      } while( true );
    }
LAB_00183037:
    lVar535 = lVar535 + 1;
    iVar530 = iVar530 + 0x80;
    lVar541 = lVar541 + 0x420;
    lVar519 = lVar519 + 0x420;
  } while( true );
}

Assistant:

NOINLINE uint64_t _hash_noRecursionNoInline_type2( const unsigned char* chars, std::size_t cnt ) const
  {
			_ULARGELARGE_INTEGER__XX allValues[ PMPML_LEVELS_64 * PMPML_CHUNK_SIZE_64 ];
			std::size_t cnts[ PMPML_LEVELS_64 ];
			std::size_t flag;
			cnts[ 1 ] = 0;
			flag = 0;

			std::size_t i;
			_ULARGELARGE_INTEGER__XX tmp_hash;
			// process full chunks
			for ( i=0; i<(cnt>>PMPML_CHUNK_SIZE_BYTES_LOG2_64); i++ )
			{
				hash_of_string_chunk_compact( curr_rd[0].random_coeff, *(ULARGE_INTEGER__XX*)(&(curr_rd[0].const_term)), ((const uint64_t*)(chars)) + ( i << PMPML_CHUNK_SIZE_LOG2_64 ), tmp_hash );
				procesNextValue( 1, tmp_hash, allValues, cnts, flag );
			}
			// process remaining incomplete chunk(s)
			// note: if string size is a multiple of chunk size, we create a new chunk (1,0,0,...0),
			// so THIS PROCESSING IS ALWAYS PERFORMED
			std::size_t tailCnt = cnt & ( PMPML_CHUNK_SIZE_BYTES_64 - 1 );
			const unsigned char* tail = chars + ( (cnt>>PMPML_CHUNK_SIZE_BYTES_LOG2_64) << PMPML_CHUNK_SIZE_BYTES_LOG2_64 );
			hash_of_beginning_of_string_chunk_type2( curr_rd[0].random_coeff, *(ULARGE_INTEGER__XX*)(&(curr_rd[0].const_term)), tail, tailCnt, tmp_hash );
			procesNextValue( 1, tmp_hash, allValues, cnts, flag );
			_ULARGELARGE_INTEGER__XX finRet = finalize( 1, allValues, cnts, flag );
			if ( finRet.HighPart == 0 ) //LIKELY
			{
				return fmix64_short( finRet.LowPart );
			}
			return finRet.LowPart;
  }